

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<4,8>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  byte bVar30;
  uint uVar31;
  ulong uVar32;
  uint uVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  int iVar105;
  undefined4 uVar106;
  vint4 bi_2;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  vint4 bi_1;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  vint4 bi;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  vfloat4 a0;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  vint4 ai;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  vint4 ai_1;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  float fVar152;
  __m128 a;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar167;
  float fVar174;
  vint4 ai_2;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar175;
  float fVar190;
  float fVar191;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar192;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  vfloat4 a0_3;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  float fVar207;
  float fVar216;
  float fVar217;
  vfloat4 b0_2;
  undefined1 auVar208 [16];
  float fVar218;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  vfloat4 a0_4;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_460;
  uint auStack_430 [4];
  undefined1 local_420 [32];
  undefined1 local_400 [16];
  undefined1 local_3f0 [8];
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined8 uStack_220;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar33;
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  float fVar130;
  float fVar138;
  float fVar139;
  float fVar151;
  float fVar153;
  float fVar166;
  
  uVar32 = (ulong)(byte)prim[1];
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 4 + 6)));
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 5 + 6)));
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 6 + 6)));
  auVar53 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 0xf + 6)));
  lVar35 = uVar32 * 0x25;
  auVar54 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar55 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 0x11 + 6)));
  auVar56 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 0x1a + 6)));
  auVar57 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 0x1b + 6)));
  auVar60 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 0x1c + 6)));
  uVar106 = *(undefined4 *)(prim + lVar35 + 0x12);
  auVar245._4_4_ = uVar106;
  auVar245._0_4_ = uVar106;
  auVar245._8_4_ = uVar106;
  auVar245._12_4_ = uVar106;
  auVar58 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar58 = vinsertps_avx(auVar58,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar43 = vsubps_avx512vl(auVar58,*(undefined1 (*) [16])(prim + lVar35 + 6));
  fVar152 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar35 + 0x16)) *
            *(float *)(prim + lVar35 + 0x1a);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar32 * 7 + 6);
  auVar64 = vpmovsxwd_avx(auVar58);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar32 * 0xb + 6);
  auVar63 = vpmovsxwd_avx(auVar61);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar32 * 9 + 6);
  auVar65 = vpmovsxwd_avx(auVar67);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar32 * 0xd + 6);
  auVar66 = vpmovsxwd_avx(auVar59);
  auVar44 = vpbroadcastd_avx512vl();
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar32 * 0x12 + 6);
  auVar45 = vpmovsxwd_avx512vl(auVar68);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar32 * 0x16 + 6);
  auVar46 = vpmovsxwd_avx512vl(auVar49);
  auVar254 = ZEXT1664(auVar46);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar32 * 0x14 + 6);
  auVar47 = vpmovsxwd_avx512vl(auVar48);
  auVar58 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar58 = vinsertps_avx512f(auVar58,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar48 = vmulps_avx512vl(auVar245,auVar43);
  auVar49 = vmulps_avx512vl(auVar245,auVar58);
  auVar50 = vcvtdq2ps_avx512vl(auVar50);
  auVar51 = vcvtdq2ps_avx512vl(auVar51);
  auVar52 = vcvtdq2ps_avx512vl(auVar52);
  auVar53 = vcvtdq2ps_avx512vl(auVar53);
  auVar54 = vcvtdq2ps_avx512vl(auVar54);
  auVar58 = vcvtdq2ps_avx(auVar55);
  auVar61 = vcvtdq2ps_avx(auVar56);
  auVar67 = vcvtdq2ps_avx(auVar57);
  auVar59 = vcvtdq2ps_avx(auVar60);
  uVar106 = auVar49._0_4_;
  auVar73._4_4_ = uVar106;
  auVar73._0_4_ = uVar106;
  auVar73._8_4_ = uVar106;
  auVar73._12_4_ = uVar106;
  auVar68 = vshufps_avx(auVar49,auVar49,0x55);
  auVar49 = vshufps_avx(auVar49,auVar49,0xaa);
  auVar55 = vmulps_avx512vl(auVar49,auVar52);
  auVar70._0_4_ = auVar49._0_4_ * auVar58._0_4_;
  auVar70._4_4_ = auVar49._4_4_ * auVar58._4_4_;
  auVar70._8_4_ = auVar49._8_4_ * auVar58._8_4_;
  auVar70._12_4_ = auVar49._12_4_ * auVar58._12_4_;
  auVar69._0_4_ = auVar59._0_4_ * auVar49._0_4_;
  auVar69._4_4_ = auVar59._4_4_ * auVar49._4_4_;
  auVar69._8_4_ = auVar59._8_4_ * auVar49._8_4_;
  auVar69._12_4_ = auVar59._12_4_ * auVar49._12_4_;
  auVar49 = vfmadd231ps_avx512vl(auVar55,auVar68,auVar51);
  auVar55 = vfmadd231ps_avx512vl(auVar70,auVar68,auVar54);
  auVar68 = vfmadd231ps_fma(auVar69,auVar67,auVar68);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar73,auVar50);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar73,auVar53);
  auVar68 = vfmadd231ps_fma(auVar68,auVar61,auVar73);
  auVar56 = vbroadcastss_avx512vl(auVar48);
  auVar57 = vshufps_avx512vl(auVar48,auVar48,0x55);
  auVar48 = vshufps_avx512vl(auVar48,auVar48,0xaa);
  auVar52 = vmulps_avx512vl(auVar48,auVar52);
  auVar58 = vmulps_avx512vl(auVar48,auVar58);
  auVar59 = vmulps_avx512vl(auVar48,auVar59);
  auVar48 = vfmadd231ps_avx512vl(auVar52,auVar57,auVar51);
  auVar51 = vfmadd231ps_avx512vl(auVar58,auVar57,auVar54);
  auVar58 = vfmadd231ps_fma(auVar59,auVar57,auVar67);
  auVar57 = vfmadd231ps_avx512vl(auVar48,auVar56,auVar50);
  auVar60 = vfmadd231ps_avx512vl(auVar51,auVar56,auVar53);
  auVar56 = vfmadd231ps_fma(auVar58,auVar56,auVar61);
  auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar258 = ZEXT1664(auVar58);
  auVar61 = vandps_avx512vl(auVar49,auVar58);
  auVar222._8_4_ = 0x219392ef;
  auVar222._0_8_ = 0x219392ef219392ef;
  auVar222._12_4_ = 0x219392ef;
  uVar38 = vcmpps_avx512vl(auVar61,auVar222,1);
  bVar41 = (bool)((byte)uVar38 & 1);
  auVar43._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar49._0_4_;
  bVar41 = (bool)((byte)(uVar38 >> 1) & 1);
  auVar43._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar49._4_4_;
  bVar41 = (bool)((byte)(uVar38 >> 2) & 1);
  auVar43._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar49._8_4_;
  bVar41 = (bool)((byte)(uVar38 >> 3) & 1);
  auVar43._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar49._12_4_;
  auVar61 = vandps_avx512vl(auVar55,auVar58);
  uVar38 = vcmpps_avx512vl(auVar61,auVar222,1);
  bVar41 = (bool)((byte)uVar38 & 1);
  auVar71._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar55._0_4_;
  bVar41 = (bool)((byte)(uVar38 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar55._4_4_;
  bVar41 = (bool)((byte)(uVar38 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar55._8_4_;
  bVar41 = (bool)((byte)(uVar38 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar55._12_4_;
  auVar58 = vandps_avx512vl(auVar68,auVar58);
  uVar38 = vcmpps_avx512vl(auVar58,auVar222,1);
  bVar41 = (bool)((byte)uVar38 & 1);
  auVar62._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar68._0_4_;
  bVar41 = (bool)((byte)(uVar38 >> 1) & 1);
  auVar62._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar68._4_4_;
  bVar41 = (bool)((byte)(uVar38 >> 2) & 1);
  auVar62._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar68._8_4_;
  bVar41 = (bool)((byte)(uVar38 >> 3) & 1);
  auVar62._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar68._12_4_;
  auVar61 = vrcp14ps_avx512vl(auVar43);
  auVar223._8_4_ = 0x3f800000;
  auVar223._0_8_ = 0x3f8000003f800000;
  auVar223._12_4_ = 0x3f800000;
  auVar58 = vfnmadd213ps_fma(auVar43,auVar61,auVar223);
  auVar67 = vfmadd132ps_fma(auVar58,auVar61,auVar61);
  auVar61 = vrcp14ps_avx512vl(auVar71);
  auVar58 = vfnmadd213ps_fma(auVar71,auVar61,auVar223);
  auVar59 = vfmadd132ps_fma(auVar58,auVar61,auVar61);
  auVar61 = vrcp14ps_avx512vl(auVar62);
  auVar58 = vfnmadd213ps_fma(auVar62,auVar61,auVar223);
  auVar68 = vfmadd132ps_fma(auVar58,auVar61,auVar61);
  auVar72._4_4_ = fVar152;
  auVar72._0_4_ = fVar152;
  auVar72._8_4_ = fVar152;
  auVar72._12_4_ = fVar152;
  auVar58 = vcvtdq2ps_avx(auVar64);
  auVar61 = vcvtdq2ps_avx(auVar63);
  auVar61 = vsubps_avx(auVar61,auVar58);
  auVar49 = vfmadd213ps_fma(auVar61,auVar72,auVar58);
  auVar58 = vcvtdq2ps_avx(auVar65);
  auVar61 = vcvtdq2ps_avx(auVar66);
  auVar61 = vsubps_avx(auVar61,auVar58);
  auVar48 = vfmadd213ps_fma(auVar61,auVar72,auVar58);
  auVar61 = vcvtdq2ps_avx512vl(auVar45);
  auVar58 = vcvtdq2ps_avx512vl(auVar46);
  auVar58 = vsubps_avx(auVar58,auVar61);
  auVar55 = vfmadd213ps_fma(auVar58,auVar72,auVar61);
  auVar52 = vcvtdq2ps_avx512vl(auVar47);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar32 * 0x18 + 6);
  auVar58 = vpmovsxwd_avx(auVar50);
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar61 = vsubps_avx(auVar58,auVar52);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar32 * 0x1d + 6);
  auVar58 = vpmovsxwd_avx(auVar51);
  auVar50 = vfmadd213ps_fma(auVar61,auVar72,auVar52);
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar32 * 0x21 + 6);
  auVar61 = vpmovsxwd_avx(auVar52);
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,auVar58);
  auVar51 = vfmadd213ps_fma(auVar61,auVar72,auVar58);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar32 * 0x1f + 6);
  auVar58 = vpmovsxwd_avx(auVar53);
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar32 * 0x23 + 6);
  auVar61 = vpmovsxwd_avx(auVar54);
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,auVar58);
  auVar61 = vfmadd213ps_fma(auVar61,auVar72,auVar58);
  auVar58 = vsubps_avx512vl(auVar49,auVar57);
  auVar66._0_4_ = auVar67._0_4_ * auVar58._0_4_;
  auVar66._4_4_ = auVar67._4_4_ * auVar58._4_4_;
  auVar66._8_4_ = auVar67._8_4_ * auVar58._8_4_;
  auVar66._12_4_ = auVar67._12_4_ * auVar58._12_4_;
  auVar58 = vsubps_avx512vl(auVar48,auVar57);
  auVar65._0_4_ = auVar67._0_4_ * auVar58._0_4_;
  auVar65._4_4_ = auVar67._4_4_ * auVar58._4_4_;
  auVar65._8_4_ = auVar67._8_4_ * auVar58._8_4_;
  auVar65._12_4_ = auVar67._12_4_ * auVar58._12_4_;
  auVar58 = vsubps_avx(auVar55,auVar60);
  auVar46._0_4_ = auVar59._0_4_ * auVar58._0_4_;
  auVar46._4_4_ = auVar59._4_4_ * auVar58._4_4_;
  auVar46._8_4_ = auVar59._8_4_ * auVar58._8_4_;
  auVar46._12_4_ = auVar59._12_4_ * auVar58._12_4_;
  auVar58 = vsubps_avx(auVar50,auVar60);
  auVar63._0_4_ = auVar59._0_4_ * auVar58._0_4_;
  auVar63._4_4_ = auVar59._4_4_ * auVar58._4_4_;
  auVar63._8_4_ = auVar59._8_4_ * auVar58._8_4_;
  auVar63._12_4_ = auVar59._12_4_ * auVar58._12_4_;
  auVar58 = vsubps_avx(auVar51,auVar56);
  auVar47._0_4_ = auVar68._0_4_ * auVar58._0_4_;
  auVar47._4_4_ = auVar68._4_4_ * auVar58._4_4_;
  auVar47._8_4_ = auVar68._8_4_ * auVar58._8_4_;
  auVar47._12_4_ = auVar68._12_4_ * auVar58._12_4_;
  auVar58 = vsubps_avx(auVar61,auVar56);
  auVar64._0_4_ = auVar68._0_4_ * auVar58._0_4_;
  auVar64._4_4_ = auVar68._4_4_ * auVar58._4_4_;
  auVar64._8_4_ = auVar68._8_4_ * auVar58._8_4_;
  auVar64._12_4_ = auVar68._12_4_ * auVar58._12_4_;
  auVar58 = vpminsd_avx(auVar66,auVar65);
  auVar61 = vpminsd_avx(auVar46,auVar63);
  auVar58 = vmaxps_avx(auVar58,auVar61);
  auVar61 = vpminsd_avx(auVar47,auVar64);
  uVar106 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar55._4_4_ = uVar106;
  auVar55._0_4_ = uVar106;
  auVar55._8_4_ = uVar106;
  auVar55._12_4_ = uVar106;
  auVar61 = vmaxps_avx512vl(auVar61,auVar55);
  auVar58 = vmaxps_avx(auVar58,auVar61);
  auVar56._8_4_ = 0x3f7ffffa;
  auVar56._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar56._12_4_ = 0x3f7ffffa;
  local_400 = vmulps_avx512vl(auVar58,auVar56);
  auVar58 = vpmaxsd_avx(auVar66,auVar65);
  auVar61 = vpmaxsd_avx(auVar46,auVar63);
  auVar58 = vminps_avx(auVar58,auVar61);
  auVar61 = vpmaxsd_avx(auVar47,auVar64);
  uVar106 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar57._4_4_ = uVar106;
  auVar57._0_4_ = uVar106;
  auVar57._8_4_ = uVar106;
  auVar57._12_4_ = uVar106;
  auVar61 = vminps_avx512vl(auVar61,auVar57);
  auVar58 = vminps_avx(auVar58,auVar61);
  auVar60._8_4_ = 0x3f800003;
  auVar60._0_8_ = 0x3f8000033f800003;
  auVar60._12_4_ = 0x3f800003;
  auVar58 = vmulps_avx512vl(auVar58,auVar60);
  uVar18 = vcmpps_avx512vl(local_400,auVar58,2);
  uVar19 = vpcmpgtd_avx512vl(auVar44,_DAT_01f4ad30);
  uVar38 = CONCAT44((int)((ulong)prim >> 0x20),(uint)((byte)uVar18 & 0xf & (byte)uVar19));
  local_200 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar58 = vpxord_avx512vl(auVar45,auVar45);
  auVar253 = ZEXT1664(auVar58);
  auVar58 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar257 = ZEXT1664(auVar58);
LAB_018c07a1:
  if (uVar38 == 0) {
    return;
  }
  lVar35 = 0;
  for (uVar32 = uVar38; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
    lVar35 = lVar35 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar6].ptr;
  fVar152 = (pGVar9->time_range).lower;
  fVar152 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar152) / ((pGVar9->time_range).upper - fVar152));
  auVar58 = vroundss_avx(ZEXT416((uint)fVar152),ZEXT416((uint)fVar152),9);
  uVar7 = *(uint *)(prim + lVar35 * 4 + 6);
  auVar61 = vaddss_avx512f(ZEXT416((uint)pGVar9->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar58 = vminss_avx(auVar58,auVar61);
  auVar60 = vmaxss_avx512f(auVar253._0_16_,auVar58);
  uVar32 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)uVar7 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar36 = (long)(int)auVar60._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar36);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar36);
  auVar58 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar32);
  lVar35 = uVar32 + 1;
  auVar61 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar35);
  lVar1 = uVar32 + 2;
  auVar67 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  lVar2 = uVar32 + 3;
  auVar59 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar11 + lVar36);
  lVar13 = *(long *)(lVar11 + 0x10 + lVar36);
  auVar68 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar32);
  auVar49 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar35);
  auVar48 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  auVar50 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar2);
  lVar12 = *(long *)(_Var10 + 0x38 + lVar36);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar36);
  auVar51 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar32);
  auVar52 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar35);
  auVar53 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  auVar54 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar2);
  lVar12 = *(long *)(lVar11 + 0x38 + lVar36);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar36);
  auVar55 = *(undefined1 (*) [16])(lVar12 + uVar32 * lVar11);
  auVar56 = *(undefined1 (*) [16])(lVar12 + lVar35 * lVar11);
  auVar57 = *(undefined1 (*) [16])(lVar12 + lVar1 * lVar11);
  auVar63 = vsubss_avx512f(ZEXT416((uint)fVar152),auVar60);
  auVar107._0_12_ = ZEXT812(0);
  auVar107._12_4_ = 0;
  auVar60 = vmulps_avx512vl(auVar59,auVar107);
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar67,auVar107);
  auVar64 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar61,auVar60);
  auVar65 = vaddps_avx512vl(auVar58,auVar64);
  auVar71 = auVar257._0_16_;
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar61,auVar71);
  auVar66 = vfnmadd231ps_avx512vl(auVar60,auVar58,auVar71);
  auVar123._0_4_ = auVar50._0_4_ * 0.0;
  auVar123._4_4_ = auVar50._4_4_ * 0.0;
  auVar123._8_4_ = auVar50._8_4_ * 0.0;
  auVar123._12_4_ = auVar50._12_4_ * 0.0;
  auVar60 = vfmadd231ps_fma(auVar123,auVar48,auVar107);
  auVar64 = vpxord_avx512vl(auVar254._0_16_,auVar254._0_16_);
  auVar64 = vfmadd213ps_avx512vl(auVar64,auVar49,auVar60);
  auVar43 = vaddps_avx512vl(auVar68,auVar64);
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar49,auVar71);
  auVar44 = vfnmadd231ps_avx512vl(auVar60,auVar68,auVar71);
  auVar60 = vxorps_avx512vl(auVar64,auVar64);
  auVar60 = vfmadd213ps_avx512vl(auVar60,auVar67,auVar59);
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar61,auVar107);
  auVar45 = vfmadd231ps_avx512vl(auVar60,auVar58,auVar107);
  auVar59 = vmulps_avx512vl(auVar59,auVar71);
  auVar67 = vfnmadd231ps_avx512vl(auVar59,auVar71,auVar67);
  auVar61 = vfmadd231ps_fma(auVar67,auVar107,auVar61);
  auVar64 = vfnmadd231ps_fma(auVar61,auVar107,auVar58);
  auVar58 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar48,auVar50);
  auVar58 = vfmadd231ps_fma(auVar58,auVar49,auVar107);
  auVar60 = vfmadd231ps_fma(auVar58,auVar68,auVar107);
  auVar58 = vmulps_avx512vl(auVar50,auVar71);
  auVar58 = vfnmadd231ps_avx512vl(auVar58,auVar71,auVar48);
  auVar58 = vfmadd231ps_fma(auVar58,auVar107,auVar49);
  auVar49 = vfnmadd231ps_fma(auVar58,auVar107,auVar68);
  auVar61 = vshufps_avx512vl(auVar66,auVar66,0xc9);
  auVar58 = vshufps_avx512vl(auVar43,auVar43,0xc9);
  auVar58 = vmulps_avx512vl(auVar66,auVar58);
  auVar58 = vfmsub231ps_avx512vl(auVar58,auVar61,auVar43);
  auVar67 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar58 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar58 = vmulps_avx512vl(auVar66,auVar58);
  auVar58 = vfmsub231ps_fma(auVar58,auVar61,auVar44);
  auVar59 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar58 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar61 = vshufps_avx(auVar60,auVar60,0xc9);
  auVar154._0_4_ = auVar64._0_4_ * auVar61._0_4_;
  auVar154._4_4_ = auVar64._4_4_ * auVar61._4_4_;
  auVar154._8_4_ = auVar64._8_4_ * auVar61._8_4_;
  auVar154._12_4_ = auVar64._12_4_ * auVar61._12_4_;
  auVar61 = vfmsub231ps_fma(auVar154,auVar58,auVar60);
  auVar68 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar61 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar155._0_4_ = auVar64._0_4_ * auVar61._0_4_;
  auVar155._4_4_ = auVar64._4_4_ * auVar61._4_4_;
  auVar155._8_4_ = auVar64._8_4_ * auVar61._8_4_;
  auVar155._12_4_ = auVar64._12_4_ * auVar61._12_4_;
  auVar58 = vfmsub231ps_fma(auVar155,auVar58,auVar49);
  auVar49 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar58 = vdpps_avx(auVar67,auVar67,0x7f);
  auVar61 = vrsqrt14ss_avx512f(auVar107,ZEXT416(auVar58._0_4_));
  auVar48 = vmulss_avx512f(auVar61,ZEXT416(0x3fc00000));
  auVar50 = vmulss_avx512f(auVar58,ZEXT416(0x3f000000));
  auVar50 = vmulss_avx512f(auVar50,auVar61);
  auVar61 = vmulss_avx512f(auVar50,ZEXT416((uint)(auVar61._0_4_ * auVar61._0_4_)));
  fVar207 = auVar48._0_4_ - auVar61._0_4_;
  auVar176._4_4_ = fVar207;
  auVar176._0_4_ = fVar207;
  auVar176._8_4_ = fVar207;
  auVar176._12_4_ = fVar207;
  auVar61 = vdpps_avx(auVar67,auVar59,0x7f);
  auVar48 = vmulps_avx512vl(auVar67,auVar176);
  auVar50 = vbroadcastss_avx512vl(auVar58);
  auVar59 = vmulps_avx512vl(auVar50,auVar59);
  fVar152 = auVar61._0_4_;
  auVar140._0_4_ = fVar152 * auVar67._0_4_;
  auVar140._4_4_ = fVar152 * auVar67._4_4_;
  auVar140._8_4_ = fVar152 * auVar67._8_4_;
  auVar140._12_4_ = fVar152 * auVar67._12_4_;
  auVar67 = vsubps_avx(auVar59,auVar140);
  auVar61 = vrcp14ss_avx512f(auVar107,ZEXT416(auVar58._0_4_));
  auVar58 = vfnmadd213ss_avx512f(auVar58,auVar61,ZEXT416(0x40000000));
  fVar152 = auVar61._0_4_ * auVar58._0_4_;
  auVar58 = vdpps_avx(auVar68,auVar68,0x7f);
  auVar61 = vrsqrt14ss_avx512f(auVar107,ZEXT416(auVar58._0_4_));
  auVar59 = vmulss_avx512f(auVar61,ZEXT416(0x3fc00000));
  auVar50 = vmulss_avx512f(auVar58,ZEXT416(0x3f000000));
  fVar221 = auVar61._0_4_;
  fVar216 = auVar59._0_4_ - auVar50._0_4_ * fVar221 * fVar221 * fVar221;
  auVar177._0_4_ = auVar68._0_4_ * fVar216;
  auVar177._4_4_ = auVar68._4_4_ * fVar216;
  auVar177._8_4_ = auVar68._8_4_ * fVar216;
  auVar177._12_4_ = auVar68._12_4_ * fVar216;
  auVar61 = vdpps_avx(auVar68,auVar49,0x7f);
  auVar59 = vbroadcastss_avx512vl(auVar58);
  auVar59 = vmulps_avx512vl(auVar59,auVar49);
  fVar221 = auVar61._0_4_;
  auVar113._0_4_ = fVar221 * auVar68._0_4_;
  auVar113._4_4_ = fVar221 * auVar68._4_4_;
  auVar113._8_4_ = fVar221 * auVar68._8_4_;
  auVar113._12_4_ = fVar221 * auVar68._12_4_;
  auVar61 = vsubps_avx(auVar59,auVar113);
  auVar59 = vrcp14ss_avx512f(auVar107,ZEXT416(auVar58._0_4_));
  auVar58 = vfnmadd213ss_avx512f(auVar58,auVar59,ZEXT416(0x40000000));
  fVar221 = auVar59._0_4_ * auVar58._0_4_;
  auVar58 = vshufps_avx512vl(auVar65,auVar65,0xff);
  auVar59 = vmulps_avx512vl(auVar58,auVar48);
  auVar50 = vsubps_avx512vl(auVar65,auVar59);
  auVar68 = vshufps_avx512vl(auVar66,auVar66,0xff);
  auVar68 = vmulps_avx512vl(auVar68,auVar48);
  auVar131._0_4_ = auVar68._0_4_ + auVar58._0_4_ * fVar207 * fVar152 * auVar67._0_4_;
  auVar131._4_4_ = auVar68._4_4_ + auVar58._4_4_ * fVar207 * fVar152 * auVar67._4_4_;
  auVar131._8_4_ = auVar68._8_4_ + auVar58._8_4_ * fVar207 * fVar152 * auVar67._8_4_;
  auVar131._12_4_ = auVar68._12_4_ + auVar58._12_4_ * fVar207 * fVar152 * auVar67._12_4_;
  auVar67 = vsubps_avx512vl(auVar66,auVar131);
  auVar60 = vaddps_avx512vl(auVar65,auVar59);
  auVar59 = vaddps_avx512vl(auVar66,auVar131);
  auVar58 = vshufps_avx512vl(auVar45,auVar45,0xff);
  auVar68 = vmulps_avx512vl(auVar58,auVar177);
  auVar65 = vsubps_avx512vl(auVar45,auVar68);
  auVar49 = vshufps_avx512vl(auVar64,auVar64,0xff);
  auVar48 = vmulps_avx512vl(auVar49,auVar177);
  auVar178._0_4_ = auVar48._0_4_ + auVar58._0_4_ * fVar216 * auVar61._0_4_ * fVar221;
  auVar178._4_4_ = auVar48._4_4_ + auVar58._4_4_ * fVar216 * auVar61._4_4_ * fVar221;
  auVar178._8_4_ = auVar48._8_4_ + auVar58._8_4_ * fVar216 * auVar61._8_4_ * fVar221;
  auVar178._12_4_ = auVar48._12_4_ + auVar58._12_4_ * fVar216 * auVar61._12_4_ * fVar221;
  auVar58 = vsubps_avx(auVar64,auVar178);
  auVar66 = vaddps_avx512vl(auVar45,auVar68);
  auVar68 = vaddps_avx512vl(auVar64,auVar178);
  auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar61 = vmulps_avx512vl(auVar67,auVar64);
  auVar168._0_4_ = auVar50._0_4_ + auVar61._0_4_;
  auVar168._4_4_ = auVar50._4_4_ + auVar61._4_4_;
  auVar168._8_4_ = auVar50._8_4_ + auVar61._8_4_;
  auVar168._12_4_ = auVar50._12_4_ + auVar61._12_4_;
  auVar58 = vmulps_avx512vl(auVar58,auVar64);
  auVar48 = vsubps_avx(auVar65,auVar58);
  auVar58 = vmulps_avx512vl(auVar59,auVar64);
  auVar43 = vaddps_avx512vl(auVar60,auVar58);
  auVar58 = vmulps_avx512vl(auVar68,auVar64);
  auVar44 = vsubps_avx512vl(auVar66,auVar58);
  auVar58 = *(undefined1 (*) [16])(lVar12 + lVar11 * lVar2);
  auVar61 = vmulps_avx512vl(auVar54,auVar107);
  auVar61 = vfmadd231ps_fma(auVar61,auVar53,auVar107);
  auVar67 = vxorps_avx512vl(auVar68,auVar68);
  auVar67 = vfmadd213ps_avx512vl(auVar67,auVar52,auVar61);
  auVar45 = vaddps_avx512vl(auVar51,auVar67);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar52,auVar71);
  auVar46 = vfnmadd231ps_avx512vl(auVar61,auVar51,auVar71);
  auVar61 = vmulps_avx512vl(auVar58,auVar107);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar57,auVar107);
  auVar67 = vxorps_avx512vl(auVar49,auVar49);
  auVar67 = vfmadd213ps_avx512vl(auVar67,auVar56,auVar61);
  auVar59 = vaddps_avx512vl(auVar55,auVar67);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar56,auVar71);
  auVar68 = vfnmadd231ps_avx512vl(auVar61,auVar55,auVar71);
  auVar61 = vxorps_avx512vl(auVar67,auVar67);
  auVar61 = vfmadd213ps_avx512vl(auVar61,auVar53,auVar54);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar52,auVar107);
  auVar47 = vfmadd231ps_avx512vl(auVar61,auVar51,auVar107);
  auVar61 = vmulps_avx512vl(auVar54,auVar71);
  auVar61 = vfnmadd231ps_avx512vl(auVar61,auVar71,auVar53);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar107,auVar52);
  auVar51 = vfnmadd231ps_avx512vl(auVar61,auVar107,auVar51);
  auVar61 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar57,auVar58);
  auVar61 = vfmadd231ps_fma(auVar61,auVar56,auVar107);
  auVar61 = vfmadd231ps_fma(auVar61,auVar55,auVar107);
  auVar58 = vmulps_avx512vl(auVar58,auVar71);
  auVar58 = vfnmadd231ps_avx512vl(auVar58,auVar71,auVar57);
  auVar58 = vfmadd231ps_fma(auVar58,auVar107,auVar56);
  auVar49 = vfnmadd231ps_fma(auVar58,auVar107,auVar55);
  auVar58 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar67 = vshufps_avx512vl(auVar59,auVar59,0xc9);
  fVar216 = auVar46._0_4_;
  auVar224._0_4_ = fVar216 * auVar67._0_4_;
  fVar217 = auVar46._4_4_;
  auVar224._4_4_ = fVar217 * auVar67._4_4_;
  fVar130 = auVar46._8_4_;
  auVar224._8_4_ = fVar130 * auVar67._8_4_;
  fVar138 = auVar46._12_4_;
  auVar224._12_4_ = fVar138 * auVar67._12_4_;
  auVar67 = vfmsub231ps_avx512vl(auVar224,auVar58,auVar59);
  auVar67 = vshufps_avx(auVar67,auVar67,0xc9);
  auVar59 = vshufps_avx512vl(auVar68,auVar68,0xc9);
  auVar234._0_4_ = fVar216 * auVar59._0_4_;
  auVar234._4_4_ = fVar217 * auVar59._4_4_;
  auVar234._8_4_ = fVar130 * auVar59._8_4_;
  auVar234._12_4_ = fVar138 * auVar59._12_4_;
  auVar58 = vfmsub231ps_avx512vl(auVar234,auVar58,auVar68);
  auVar59 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar52 = vshufps_avx512vl(auVar51,auVar51,0xc9);
  auVar58 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar58 = vmulps_avx512vl(auVar51,auVar58);
  auVar58 = vfmsub231ps_fma(auVar58,auVar52,auVar61);
  auVar68 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar61 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar58 = vdpps_avx(auVar67,auVar67,0x7f);
  auVar61 = vmulps_avx512vl(auVar51,auVar61);
  auVar61 = vfmsub231ps_fma(auVar61,auVar52,auVar49);
  auVar49 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar61 = vrsqrt14ss_avx512f(auVar107,ZEXT416(auVar58._0_4_));
  auVar52 = vmulss_avx512f(auVar61,ZEXT416(0x3fc00000));
  auVar53 = vmulss_avx512f(auVar58,ZEXT416(0x3f000000));
  auVar53 = vmulss_avx512f(auVar53,auVar61);
  auVar61 = vmulss_avx512f(auVar53,ZEXT416((uint)(auVar61._0_4_ * auVar61._0_4_)));
  auVar61 = vsubss_avx512f(auVar52,auVar61);
  auVar246._0_4_ = auVar61._0_4_;
  auVar246._4_4_ = auVar246._0_4_;
  auVar246._8_4_ = auVar246._0_4_;
  auVar246._12_4_ = auVar246._0_4_;
  auVar52 = vmulps_avx512vl(auVar67,auVar246);
  auVar61 = vdpps_avx(auVar67,auVar59,0x7f);
  auVar53 = vbroadcastss_avx512vl(auVar58);
  auVar59 = vmulps_avx512vl(auVar53,auVar59);
  fVar152 = auVar61._0_4_;
  auVar156._0_4_ = auVar67._0_4_ * fVar152;
  auVar156._4_4_ = auVar67._4_4_ * fVar152;
  auVar156._8_4_ = auVar67._8_4_ * fVar152;
  auVar156._12_4_ = auVar67._12_4_ * fVar152;
  auVar67 = vsubps_avx(auVar59,auVar156);
  auVar61 = vrcp14ss_avx512f(auVar107,ZEXT416(auVar58._0_4_));
  auVar58 = vfnmadd213ss_avx512f(auVar58,auVar61,ZEXT416(0x40000000));
  fVar152 = auVar61._0_4_ * auVar58._0_4_;
  auVar58 = vdpps_avx(auVar68,auVar68,0x7f);
  auVar61 = vrsqrt14ss_avx512f(auVar107,ZEXT416(auVar58._0_4_));
  auVar59 = vmulss_avx512f(auVar61,ZEXT416(0x3fc00000));
  auVar53 = vmulss_avx512f(auVar58,ZEXT416(0x3f000000));
  fVar221 = auVar61._0_4_;
  fVar207 = auVar59._0_4_ - auVar53._0_4_ * fVar221 * fVar221 * fVar221;
  auVar240._0_4_ = auVar68._0_4_ * fVar207;
  auVar240._4_4_ = auVar68._4_4_ * fVar207;
  auVar240._8_4_ = auVar68._8_4_ * fVar207;
  auVar240._12_4_ = auVar68._12_4_ * fVar207;
  auVar61 = vdpps_avx(auVar68,auVar49,0x7f);
  auVar59 = vbroadcastss_avx512vl(auVar58);
  auVar59 = vmulps_avx512vl(auVar59,auVar49);
  fVar221 = auVar61._0_4_;
  auVar201._0_4_ = auVar68._0_4_ * fVar221;
  auVar201._4_4_ = auVar68._4_4_ * fVar221;
  auVar201._8_4_ = auVar68._8_4_ * fVar221;
  auVar201._12_4_ = auVar68._12_4_ * fVar221;
  auVar61 = vsubps_avx(auVar59,auVar201);
  auVar59 = vrcp14ss_avx512f(auVar107,ZEXT416(auVar58._0_4_));
  auVar58 = vfnmadd213ss_avx512f(auVar58,auVar59,ZEXT416(0x40000000));
  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  fVar221 = auVar58._0_4_ * auVar59._0_4_;
  auVar59 = vshufps_avx512vl(auVar45,auVar45,0xff);
  auVar68 = vmulps_avx512vl(auVar59,auVar52);
  auVar49 = vsubps_avx512vl(auVar45,auVar68);
  auVar58 = vshufps_avx(auVar46,auVar46,0xff);
  auVar58 = vmulps_avx512vl(auVar58,auVar52);
  auVar141._0_4_ = auVar58._0_4_ + auVar59._0_4_ * auVar246._0_4_ * fVar152 * auVar67._0_4_;
  auVar141._4_4_ = auVar58._4_4_ + auVar59._4_4_ * auVar246._0_4_ * fVar152 * auVar67._4_4_;
  auVar141._8_4_ = auVar58._8_4_ + auVar59._8_4_ * auVar246._0_4_ * fVar152 * auVar67._8_4_;
  auVar141._12_4_ = auVar58._12_4_ + auVar59._12_4_ * auVar246._0_4_ * fVar152 * auVar67._12_4_;
  auVar58 = vsubps_avx(auVar46,auVar141);
  auVar67 = vaddps_avx512vl(auVar45,auVar68);
  auVar142._0_4_ = fVar216 + auVar141._0_4_;
  auVar142._4_4_ = fVar217 + auVar141._4_4_;
  auVar142._8_4_ = fVar130 + auVar141._8_4_;
  auVar142._12_4_ = fVar138 + auVar141._12_4_;
  auVar59 = vshufps_avx512vl(auVar47,auVar47,0xff);
  auVar235._0_4_ = auVar59._0_4_ * auVar240._0_4_;
  auVar235._4_4_ = auVar59._4_4_ * auVar240._4_4_;
  auVar235._8_4_ = auVar59._8_4_ * auVar240._8_4_;
  auVar235._12_4_ = auVar59._12_4_ * auVar240._12_4_;
  auVar68 = vsubps_avx512vl(auVar47,auVar235);
  auVar52 = vshufps_avx512vl(auVar51,auVar51,0xff);
  auVar52 = vmulps_avx512vl(auVar52,auVar240);
  auVar157._0_4_ = auVar52._0_4_ + auVar59._0_4_ * fVar207 * auVar61._0_4_ * fVar221;
  auVar157._4_4_ = auVar52._4_4_ + auVar59._4_4_ * fVar207 * auVar61._4_4_ * fVar221;
  auVar157._8_4_ = auVar52._8_4_ + auVar59._8_4_ * fVar207 * auVar61._8_4_ * fVar221;
  auVar157._12_4_ = auVar52._12_4_ + auVar59._12_4_ * fVar207 * auVar61._12_4_ * fVar221;
  auVar61 = vsubps_avx512vl(auVar51,auVar157);
  auVar59 = vaddps_avx512vl(auVar47,auVar235);
  auVar51 = vaddps_avx512vl(auVar51,auVar157);
  auVar58 = vmulps_avx512vl(auVar58,auVar64);
  auVar202._0_4_ = auVar49._0_4_ + auVar58._0_4_;
  auVar202._4_4_ = auVar49._4_4_ + auVar58._4_4_;
  auVar202._8_4_ = auVar49._8_4_ + auVar58._8_4_;
  auVar202._12_4_ = auVar49._12_4_ + auVar58._12_4_;
  auVar58 = vmulps_avx512vl(auVar61,auVar64);
  auVar58 = vsubps_avx(auVar68,auVar58);
  auVar61 = vmulps_avx512vl(auVar142,auVar64);
  auVar143._0_4_ = auVar67._0_4_ + auVar61._0_4_;
  auVar143._4_4_ = auVar67._4_4_ + auVar61._4_4_;
  auVar143._8_4_ = auVar67._8_4_ + auVar61._8_4_;
  auVar143._12_4_ = auVar67._12_4_ + auVar61._12_4_;
  auVar61 = vmulps_avx512vl(auVar51,auVar64);
  auVar259 = ZEXT464(0x3f800000);
  auVar61 = vsubps_avx(auVar59,auVar61);
  auVar51 = vbroadcastss_avx512vl(auVar63);
  auVar52 = vsubss_avx512f(ZEXT416(0x3f800000),auVar63);
  auVar45._0_4_ = auVar52._0_4_;
  auVar45._4_4_ = auVar45._0_4_;
  auVar45._8_4_ = auVar45._0_4_;
  auVar45._12_4_ = auVar45._0_4_;
  auVar49 = vmulps_avx512vl(auVar51,auVar49);
  auVar52 = vmulps_avx512vl(auVar51,auVar202);
  auVar58 = vmulps_avx512vl(auVar51,auVar58);
  auVar247._0_4_ = auVar51._0_4_ * auVar68._0_4_;
  auVar247._4_4_ = auVar51._4_4_ * auVar68._4_4_;
  auVar247._8_4_ = auVar51._8_4_ * auVar68._8_4_;
  auVar247._12_4_ = auVar51._12_4_ * auVar68._12_4_;
  local_340 = vfmadd231ps_avx512vl(auVar49,auVar45,auVar50);
  local_350 = vfmadd231ps_avx512vl(auVar52,auVar45,auVar168);
  local_360 = vfmadd231ps_avx512vl(auVar58,auVar45,auVar48);
  local_370 = vfmadd231ps_fma(auVar247,auVar45,auVar65);
  auVar58 = vmulps_avx512vl(auVar51,auVar67);
  auVar67 = vmulps_avx512vl(auVar51,auVar143);
  auVar61 = vmulps_avx512vl(auVar51,auVar61);
  auVar236._0_4_ = auVar51._0_4_ * auVar59._0_4_;
  auVar236._4_4_ = auVar51._4_4_ * auVar59._4_4_;
  auVar236._8_4_ = auVar51._8_4_ * auVar59._8_4_;
  auVar236._12_4_ = auVar51._12_4_ * auVar59._12_4_;
  _local_380 = vfmadd231ps_avx512vl(auVar58,auVar45,auVar60);
  _local_390 = vfmadd231ps_avx512vl(auVar67,auVar45,auVar43);
  _local_3a0 = vfmadd231ps_avx512vl(auVar61,auVar45,auVar44);
  _local_3b0 = vfmadd231ps_fma(auVar236,auVar45,auVar66);
  auVar58 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar58 = vinsertps_avx(auVar58,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar152 = *(float *)(ray + k * 4 + 0x60);
  local_2c0 = vsubps_avx512vl(local_340,auVar58);
  uVar106 = local_2c0._0_4_;
  auVar114._4_4_ = uVar106;
  auVar114._0_4_ = uVar106;
  auVar114._8_4_ = uVar106;
  auVar114._12_4_ = uVar106;
  auVar61 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar67 = vshufps_avx(local_2c0,local_2c0,0xaa);
  aVar4 = pre->ray_space[k].vx.field_0;
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar221 = pre->ray_space[k].vz.field_0.m128[0];
  fVar207 = pre->ray_space[k].vz.field_0.m128[1];
  fVar216 = pre->ray_space[k].vz.field_0.m128[2];
  fVar217 = pre->ray_space[k].vz.field_0.m128[3];
  auVar108._0_4_ = fVar221 * auVar67._0_4_;
  auVar108._4_4_ = fVar207 * auVar67._4_4_;
  auVar108._8_4_ = fVar216 * auVar67._8_4_;
  auVar108._12_4_ = fVar217 * auVar67._12_4_;
  auVar61 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar5,auVar61);
  auVar48 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar4,auVar114);
  local_2d0 = vsubps_avx512vl(local_350,auVar58);
  uVar106 = local_2d0._0_4_;
  auVar117._4_4_ = uVar106;
  auVar117._0_4_ = uVar106;
  auVar117._8_4_ = uVar106;
  auVar117._12_4_ = uVar106;
  auVar61 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar67 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar115._0_4_ = fVar221 * auVar67._0_4_;
  auVar115._4_4_ = fVar207 * auVar67._4_4_;
  auVar115._8_4_ = fVar216 * auVar67._8_4_;
  auVar115._12_4_ = fVar217 * auVar67._12_4_;
  auVar61 = vfmadd231ps_fma(auVar115,(undefined1  [16])aVar5,auVar61);
  auVar50 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar4,auVar117);
  local_2e0 = vsubps_avx512vl(local_360,auVar58);
  uVar106 = local_2e0._0_4_;
  auVar158._4_4_ = uVar106;
  auVar158._0_4_ = uVar106;
  auVar158._8_4_ = uVar106;
  auVar158._12_4_ = uVar106;
  auVar61 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar67 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar118._0_4_ = fVar221 * auVar67._0_4_;
  auVar118._4_4_ = fVar207 * auVar67._4_4_;
  auVar118._8_4_ = fVar216 * auVar67._8_4_;
  auVar118._12_4_ = fVar217 * auVar67._12_4_;
  auVar61 = vfmadd231ps_fma(auVar118,(undefined1  [16])aVar5,auVar61);
  auVar51 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar4,auVar158);
  local_2f0 = vsubps_avx(local_370,auVar58);
  uVar106 = local_2f0._0_4_;
  auVar179._4_4_ = uVar106;
  auVar179._0_4_ = uVar106;
  auVar179._8_4_ = uVar106;
  auVar179._12_4_ = uVar106;
  auVar61 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar67 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar159._0_4_ = fVar221 * auVar67._0_4_;
  auVar159._4_4_ = fVar207 * auVar67._4_4_;
  auVar159._8_4_ = fVar216 * auVar67._8_4_;
  auVar159._12_4_ = fVar217 * auVar67._12_4_;
  auVar61 = vfmadd231ps_fma(auVar159,(undefined1  [16])aVar5,auVar61);
  auVar52 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar4,auVar179);
  local_300 = vsubps_avx512vl(_local_380,auVar58);
  uVar106 = local_300._0_4_;
  auVar180._4_4_ = uVar106;
  auVar180._0_4_ = uVar106;
  auVar180._8_4_ = uVar106;
  auVar180._12_4_ = uVar106;
  auVar61 = vshufps_avx(local_300,local_300,0x55);
  auVar67 = vshufps_avx(local_300,local_300,0xaa);
  auVar203._0_4_ = auVar67._0_4_ * fVar221;
  auVar203._4_4_ = auVar67._4_4_ * fVar207;
  auVar203._8_4_ = auVar67._8_4_ * fVar216;
  auVar203._12_4_ = auVar67._12_4_ * fVar217;
  auVar61 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar5,auVar61);
  auVar53 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar4,auVar180);
  local_310 = vsubps_avx512vl(_local_390,auVar58);
  uVar106 = local_310._0_4_;
  auVar181._4_4_ = uVar106;
  auVar181._0_4_ = uVar106;
  auVar181._8_4_ = uVar106;
  auVar181._12_4_ = uVar106;
  auVar61 = vshufps_avx(local_310,local_310,0x55);
  auVar67 = vshufps_avx(local_310,local_310,0xaa);
  auVar208._0_4_ = auVar67._0_4_ * fVar221;
  auVar208._4_4_ = auVar67._4_4_ * fVar207;
  auVar208._8_4_ = auVar67._8_4_ * fVar216;
  auVar208._12_4_ = auVar67._12_4_ * fVar217;
  auVar61 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar5,auVar61);
  auVar54 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar4,auVar181);
  local_320 = vsubps_avx512vl(_local_3a0,auVar58);
  uVar106 = local_320._0_4_;
  auVar182._4_4_ = uVar106;
  auVar182._0_4_ = uVar106;
  auVar182._8_4_ = uVar106;
  auVar182._12_4_ = uVar106;
  auVar61 = vshufps_avx(local_320,local_320,0x55);
  auVar67 = vshufps_avx(local_320,local_320,0xaa);
  auVar225._0_4_ = auVar67._0_4_ * fVar221;
  auVar225._4_4_ = auVar67._4_4_ * fVar207;
  auVar225._8_4_ = auVar67._8_4_ * fVar216;
  auVar225._12_4_ = auVar67._12_4_ * fVar217;
  auVar61 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar5,auVar61);
  auVar55 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar4,auVar182);
  local_330 = vsubps_avx(_local_3b0,auVar58);
  uVar106 = local_330._0_4_;
  auVar132._4_4_ = uVar106;
  auVar132._0_4_ = uVar106;
  auVar132._8_4_ = uVar106;
  auVar132._12_4_ = uVar106;
  auVar58 = vshufps_avx(local_330,local_330,0x55);
  auVar61 = vshufps_avx(local_330,local_330,0xaa);
  auVar169._0_4_ = auVar61._0_4_ * fVar221;
  auVar169._4_4_ = auVar61._4_4_ * fVar207;
  auVar169._8_4_ = auVar61._8_4_ * fVar216;
  auVar169._12_4_ = auVar61._12_4_ * fVar217;
  auVar58 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar5,auVar58);
  auVar56 = vfmadd231ps_fma(auVar58,(undefined1  [16])aVar4,auVar132);
  auVar67 = vmovlhps_avx(auVar48,auVar53);
  auVar59 = vmovlhps_avx(auVar50,auVar54);
  auVar68 = vmovlhps_avx(auVar51,auVar55);
  _local_2a0 = vmovlhps_avx512f(auVar52,auVar56);
  auVar61 = vminps_avx(auVar67,auVar59);
  auVar58 = vmaxps_avx(auVar67,auVar59);
  auVar49 = vminps_avx512vl(auVar68,_local_2a0);
  auVar61 = vminps_avx(auVar61,auVar49);
  auVar49 = vmaxps_avx512vl(auVar68,_local_2a0);
  auVar58 = vmaxps_avx(auVar58,auVar49);
  auVar49 = vshufpd_avx(auVar61,auVar61,3);
  auVar61 = vminps_avx(auVar61,auVar49);
  auVar49 = vshufpd_avx(auVar58,auVar58,3);
  auVar58 = vmaxps_avx(auVar58,auVar49);
  auVar61 = vandps_avx512vl(auVar61,auVar258._0_16_);
  auVar58 = vandps_avx512vl(auVar58,auVar258._0_16_);
  auVar58 = vmaxps_avx(auVar61,auVar58);
  auVar61 = vmovshdup_avx(auVar58);
  auVar58 = vmaxss_avx(auVar61,auVar58);
  auVar61 = vmovddup_avx512vl(auVar48);
  auVar49 = vmovddup_avx512vl(auVar50);
  auVar48 = vmovddup_avx512vl(auVar51);
  auVar50 = vmovddup_avx512vl(auVar52);
  local_2b0 = ZEXT416((uint)(auVar58._0_4_ * 9.536743e-07));
  local_240 = vbroadcastss_avx512vl(local_2b0);
  auVar58 = vxorps_avx512vl(local_240._0_16_,auVar57);
  local_260 = vbroadcastss_avx512vl(auVar58);
  uVar32 = 0;
  local_270 = vsubps_avx(auVar59,auVar67);
  local_280 = vsubps_avx(auVar68,auVar59);
  local_290 = vsubps_avx512vl(_local_2a0,auVar68);
  local_3c0 = vsubps_avx512vl(_local_380,local_340);
  local_3d0 = vsubps_avx512vl(_local_390,local_350);
  local_3e0 = vsubps_avx512vl(_local_3a0,local_360);
  _local_3f0 = vsubps_avx(_local_3b0,local_370);
  local_1c0 = vpbroadcastd_avx512vl();
  local_1e0 = vpbroadcastd_avx512vl();
  auVar58 = ZEXT816(0x3f80000000000000);
  auVar44 = auVar58;
LAB_018c12a6:
  do {
    auVar51 = vshufps_avx(auVar44,auVar44,0x50);
    auVar241._8_4_ = 0x3f800000;
    auVar241._0_8_ = 0x3f8000003f800000;
    auVar241._12_4_ = 0x3f800000;
    auVar94._16_4_ = 0x3f800000;
    auVar94._0_16_ = auVar241;
    auVar94._20_4_ = 0x3f800000;
    auVar94._24_4_ = 0x3f800000;
    auVar94._28_4_ = 0x3f800000;
    auVar52 = vsubps_avx(auVar241,auVar51);
    fVar221 = auVar51._0_4_;
    fVar130 = auVar53._0_4_;
    auVar133._0_4_ = fVar130 * fVar221;
    fVar207 = auVar51._4_4_;
    fVar138 = auVar53._4_4_;
    auVar133._4_4_ = fVar138 * fVar207;
    fVar216 = auVar51._8_4_;
    auVar133._8_4_ = fVar130 * fVar216;
    fVar217 = auVar51._12_4_;
    auVar133._12_4_ = fVar138 * fVar217;
    fVar139 = auVar54._0_4_;
    auVar144._0_4_ = fVar139 * fVar221;
    fVar151 = auVar54._4_4_;
    auVar144._4_4_ = fVar151 * fVar207;
    auVar144._8_4_ = fVar139 * fVar216;
    auVar144._12_4_ = fVar151 * fVar217;
    fVar153 = auVar55._0_4_;
    auVar160._0_4_ = fVar153 * fVar221;
    fVar166 = auVar55._4_4_;
    auVar160._4_4_ = fVar166 * fVar207;
    auVar160._8_4_ = fVar153 * fVar216;
    auVar160._12_4_ = fVar166 * fVar217;
    fVar167 = auVar56._0_4_;
    auVar119._0_4_ = fVar167 * fVar221;
    fVar174 = auVar56._4_4_;
    auVar119._4_4_ = fVar174 * fVar207;
    auVar119._8_4_ = fVar167 * fVar216;
    auVar119._12_4_ = fVar174 * fVar217;
    auVar57 = vfmadd231ps_avx512vl(auVar133,auVar52,auVar61);
    auVar60 = vfmadd231ps_avx512vl(auVar144,auVar52,auVar49);
    auVar64 = vfmadd231ps_avx512vl(auVar160,auVar52,auVar48);
    auVar52 = vfmadd231ps_avx512vl(auVar119,auVar50,auVar52);
    auVar51 = vmovshdup_avx(auVar58);
    fVar207 = auVar58._0_4_;
    fVar221 = (auVar51._0_4_ - fVar207) * 0.04761905;
    auVar88._4_4_ = fVar207;
    auVar88._0_4_ = fVar207;
    auVar88._8_4_ = fVar207;
    auVar88._12_4_ = fVar207;
    auVar88._16_4_ = fVar207;
    auVar88._20_4_ = fVar207;
    auVar88._24_4_ = fVar207;
    auVar88._28_4_ = fVar207;
    auVar77._0_8_ = auVar51._0_8_;
    auVar77._8_8_ = auVar77._0_8_;
    auVar77._16_8_ = auVar77._0_8_;
    auVar77._24_8_ = auVar77._0_8_;
    auVar91 = vsubps_avx(auVar77,auVar88);
    uVar106 = auVar57._0_4_;
    auVar92._4_4_ = uVar106;
    auVar92._0_4_ = uVar106;
    auVar92._8_4_ = uVar106;
    auVar92._12_4_ = uVar106;
    auVar92._16_4_ = uVar106;
    auVar92._20_4_ = uVar106;
    auVar92._24_4_ = uVar106;
    auVar92._28_4_ = uVar106;
    auVar80._8_4_ = 1;
    auVar80._0_8_ = 0x100000001;
    auVar80._12_4_ = 1;
    auVar80._16_4_ = 1;
    auVar80._20_4_ = 1;
    auVar80._24_4_ = 1;
    auVar80._28_4_ = 1;
    auVar90 = ZEXT1632(auVar57);
    auVar89 = vpermps_avx2(auVar80,auVar90);
    auVar74 = vbroadcastss_avx512vl(auVar60);
    auVar84 = ZEXT1632(auVar60);
    auVar75 = vpermps_avx512vl(auVar80,auVar84);
    auVar76 = vbroadcastss_avx512vl(auVar64);
    auVar85 = ZEXT1632(auVar64);
    auVar77 = vpermps_avx512vl(auVar80,auVar85);
    auVar78 = vbroadcastss_avx512vl(auVar52);
    auVar87 = ZEXT1632(auVar52);
    auVar79 = vpermps_avx512vl(auVar80,auVar87);
    auVar93._4_4_ = fVar221;
    auVar93._0_4_ = fVar221;
    auVar93._8_4_ = fVar221;
    auVar93._12_4_ = fVar221;
    auVar93._16_4_ = fVar221;
    auVar93._20_4_ = fVar221;
    auVar93._24_4_ = fVar221;
    auVar93._28_4_ = fVar221;
    auVar86._8_4_ = 2;
    auVar86._0_8_ = 0x200000002;
    auVar86._12_4_ = 2;
    auVar86._16_4_ = 2;
    auVar86._20_4_ = 2;
    auVar86._24_4_ = 2;
    auVar86._28_4_ = 2;
    auVar80 = vpermps_avx512vl(auVar86,auVar90);
    auVar81 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar82 = vpermps_avx512vl(auVar81,auVar90);
    auVar83 = vpermps_avx512vl(auVar86,auVar84);
    auVar84 = vpermps_avx512vl(auVar81,auVar84);
    auVar90 = vpermps_avx2(auVar86,auVar85);
    auVar85 = vpermps_avx512vl(auVar81,auVar85);
    auVar86 = vpermps_avx512vl(auVar86,auVar87);
    auVar81 = vpermps_avx512vl(auVar81,auVar87);
    auVar51 = vfmadd132ps_fma(auVar91,auVar88,_DAT_01f7b040);
    auVar91 = vsubps_avx(auVar94,ZEXT1632(auVar51));
    auVar87 = vmulps_avx512vl(auVar74,ZEXT1632(auVar51));
    auVar94 = ZEXT1632(auVar51);
    auVar88 = vmulps_avx512vl(auVar75,auVar94);
    auVar52 = vfmadd231ps_fma(auVar87,auVar91,auVar92);
    auVar57 = vfmadd231ps_fma(auVar88,auVar91,auVar89);
    auVar87 = vmulps_avx512vl(auVar76,auVar94);
    auVar88 = vmulps_avx512vl(auVar77,auVar94);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar91,auVar74);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar91,auVar75);
    auVar74 = vmulps_avx512vl(auVar78,auVar94);
    auVar92 = ZEXT1632(auVar51);
    auVar75 = vmulps_avx512vl(auVar79,auVar92);
    auVar76 = vfmadd231ps_avx512vl(auVar74,auVar91,auVar76);
    auVar77 = vfmadd231ps_avx512vl(auVar75,auVar91,auVar77);
    fVar216 = auVar51._0_4_;
    fVar217 = auVar51._4_4_;
    auVar74._4_4_ = fVar217 * auVar87._4_4_;
    auVar74._0_4_ = fVar216 * auVar87._0_4_;
    fVar218 = auVar51._8_4_;
    auVar74._8_4_ = fVar218 * auVar87._8_4_;
    fVar219 = auVar51._12_4_;
    auVar74._12_4_ = fVar219 * auVar87._12_4_;
    auVar74._16_4_ = auVar87._16_4_ * 0.0;
    auVar74._20_4_ = auVar87._20_4_ * 0.0;
    auVar74._24_4_ = auVar87._24_4_ * 0.0;
    auVar74._28_4_ = fVar207;
    auVar75._4_4_ = fVar217 * auVar88._4_4_;
    auVar75._0_4_ = fVar216 * auVar88._0_4_;
    auVar75._8_4_ = fVar218 * auVar88._8_4_;
    auVar75._12_4_ = fVar219 * auVar88._12_4_;
    auVar75._16_4_ = auVar88._16_4_ * 0.0;
    auVar75._20_4_ = auVar88._20_4_ * 0.0;
    auVar75._24_4_ = auVar88._24_4_ * 0.0;
    auVar75._28_4_ = auVar89._28_4_;
    auVar52 = vfmadd231ps_fma(auVar74,auVar91,ZEXT1632(auVar52));
    auVar57 = vfmadd231ps_fma(auVar75,auVar91,ZEXT1632(auVar57));
    auVar79._0_4_ = fVar216 * auVar76._0_4_;
    auVar79._4_4_ = fVar217 * auVar76._4_4_;
    auVar79._8_4_ = fVar218 * auVar76._8_4_;
    auVar79._12_4_ = fVar219 * auVar76._12_4_;
    auVar79._16_4_ = auVar76._16_4_ * 0.0;
    auVar79._20_4_ = auVar76._20_4_ * 0.0;
    auVar79._24_4_ = auVar76._24_4_ * 0.0;
    auVar79._28_4_ = 0;
    auVar89._4_4_ = fVar217 * auVar77._4_4_;
    auVar89._0_4_ = fVar216 * auVar77._0_4_;
    auVar89._8_4_ = fVar218 * auVar77._8_4_;
    auVar89._12_4_ = fVar219 * auVar77._12_4_;
    auVar89._16_4_ = auVar77._16_4_ * 0.0;
    auVar89._20_4_ = auVar77._20_4_ * 0.0;
    auVar89._24_4_ = auVar77._24_4_ * 0.0;
    auVar89._28_4_ = auVar76._28_4_;
    auVar60 = vfmadd231ps_fma(auVar79,auVar91,auVar87);
    auVar64 = vfmadd231ps_fma(auVar89,auVar91,auVar88);
    auVar76._28_4_ = auVar88._28_4_;
    auVar76._0_28_ =
         ZEXT1628(CONCAT412(fVar219 * auVar64._12_4_,
                            CONCAT48(fVar218 * auVar64._8_4_,
                                     CONCAT44(fVar217 * auVar64._4_4_,fVar216 * auVar64._0_4_))));
    auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar219 * auVar60._12_4_,
                                                 CONCAT48(fVar218 * auVar60._8_4_,
                                                          CONCAT44(fVar217 * auVar60._4_4_,
                                                                   fVar216 * auVar60._0_4_)))),
                              auVar91,ZEXT1632(auVar52));
    auVar65 = vfmadd231ps_fma(auVar76,auVar91,ZEXT1632(auVar57));
    auVar89 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar52));
    auVar74 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar57));
    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar89 = vmulps_avx512vl(auVar89,auVar75);
    auVar74 = vmulps_avx512vl(auVar74,auVar75);
    auVar87._0_4_ = fVar221 * auVar89._0_4_;
    auVar87._4_4_ = fVar221 * auVar89._4_4_;
    auVar87._8_4_ = fVar221 * auVar89._8_4_;
    auVar87._12_4_ = fVar221 * auVar89._12_4_;
    auVar87._16_4_ = fVar221 * auVar89._16_4_;
    auVar87._20_4_ = fVar221 * auVar89._20_4_;
    auVar87._24_4_ = fVar221 * auVar89._24_4_;
    auVar87._28_4_ = 0;
    auVar89 = vmulps_avx512vl(auVar93,auVar74);
    auVar57 = vxorps_avx512vl(auVar78._0_16_,auVar78._0_16_);
    auVar74 = vpermt2ps_avx512vl(ZEXT1632(auVar63),_DAT_01fb9fc0,ZEXT1632(auVar57));
    auVar76 = vpermt2ps_avx512vl(ZEXT1632(auVar65),_DAT_01fb9fc0,ZEXT1632(auVar57));
    auVar122._0_4_ = auVar87._0_4_ + auVar63._0_4_;
    auVar122._4_4_ = auVar87._4_4_ + auVar63._4_4_;
    auVar122._8_4_ = auVar87._8_4_ + auVar63._8_4_;
    auVar122._12_4_ = auVar87._12_4_ + auVar63._12_4_;
    auVar122._16_4_ = auVar87._16_4_ + 0.0;
    auVar122._20_4_ = auVar87._20_4_ + 0.0;
    auVar122._24_4_ = auVar87._24_4_ + 0.0;
    auVar122._28_4_ = 0;
    auVar88 = ZEXT1632(auVar57);
    auVar77 = vpermt2ps_avx512vl(auVar87,_DAT_01fb9fc0,auVar88);
    auVar78 = vaddps_avx512vl(ZEXT1632(auVar65),auVar89);
    auVar79 = vpermt2ps_avx512vl(auVar89,_DAT_01fb9fc0,auVar88);
    auVar89 = vsubps_avx(auVar74,auVar77);
    auVar77 = vsubps_avx512vl(auVar76,auVar79);
    auVar79 = vmulps_avx512vl(auVar83,auVar92);
    auVar87 = vmulps_avx512vl(auVar84,auVar92);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar91,auVar80);
    auVar80 = vfmadd231ps_avx512vl(auVar87,auVar91,auVar82);
    auVar82 = vmulps_avx512vl(auVar90,auVar92);
    auVar87 = vmulps_avx512vl(auVar85,auVar92);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar91,auVar83);
    auVar83 = vfmadd231ps_avx512vl(auVar87,auVar91,auVar84);
    auVar84 = vmulps_avx512vl(auVar86,auVar92);
    auVar81 = vmulps_avx512vl(auVar81,auVar92);
    auVar52 = vfmadd231ps_fma(auVar84,auVar91,auVar90);
    auVar90 = vfmadd231ps_avx512vl(auVar81,auVar91,auVar85);
    auVar81 = vmulps_avx512vl(auVar92,auVar82);
    auVar86 = ZEXT1632(auVar51);
    auVar84 = vmulps_avx512vl(auVar86,auVar83);
    auVar79 = vfmadd231ps_avx512vl(auVar81,auVar91,auVar79);
    auVar80 = vfmadd231ps_avx512vl(auVar84,auVar91,auVar80);
    auVar90 = vmulps_avx512vl(auVar86,auVar90);
    auVar81 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar219 * auVar52._12_4_,
                                            CONCAT48(fVar218 * auVar52._8_4_,
                                                     CONCAT44(fVar217 * auVar52._4_4_,
                                                              fVar216 * auVar52._0_4_)))),auVar91,
                         auVar82);
    auVar82 = vfmadd231ps_avx512vl(auVar90,auVar91,auVar83);
    auVar90._4_4_ = fVar217 * auVar81._4_4_;
    auVar90._0_4_ = fVar216 * auVar81._0_4_;
    auVar90._8_4_ = fVar218 * auVar81._8_4_;
    auVar90._12_4_ = fVar219 * auVar81._12_4_;
    auVar90._16_4_ = auVar81._16_4_ * 0.0;
    auVar90._20_4_ = auVar81._20_4_ * 0.0;
    auVar90._24_4_ = auVar81._24_4_ * 0.0;
    auVar90._28_4_ = auVar85._28_4_;
    auVar83 = vmulps_avx512vl(auVar86,auVar82);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar91,auVar79);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar80,auVar91);
    auVar91 = vsubps_avx512vl(auVar81,auVar79);
    auVar79 = vsubps_avx512vl(auVar82,auVar80);
    auVar80 = vmulps_avx512vl(auVar91,auVar75);
    auVar75 = vmulps_avx512vl(auVar79,auVar75);
    fVar207 = fVar221 * auVar80._0_4_;
    fVar216 = fVar221 * auVar80._4_4_;
    auVar91._4_4_ = fVar216;
    auVar91._0_4_ = fVar207;
    fVar217 = fVar221 * auVar80._8_4_;
    auVar91._8_4_ = fVar217;
    fVar218 = fVar221 * auVar80._12_4_;
    auVar91._12_4_ = fVar218;
    fVar219 = fVar221 * auVar80._16_4_;
    auVar91._16_4_ = fVar219;
    fVar220 = fVar221 * auVar80._20_4_;
    auVar91._20_4_ = fVar220;
    fVar221 = fVar221 * auVar80._24_4_;
    auVar91._24_4_ = fVar221;
    auVar91._28_4_ = auVar80._28_4_;
    auVar75 = vmulps_avx512vl(auVar93,auVar75);
    auVar79 = vpermt2ps_avx512vl(auVar90,_DAT_01fb9fc0,auVar88);
    auVar81 = vpermt2ps_avx512vl(auVar83,_DAT_01fb9fc0,auVar88);
    auVar206._0_4_ = auVar90._0_4_ + fVar207;
    auVar206._4_4_ = auVar90._4_4_ + fVar216;
    auVar206._8_4_ = auVar90._8_4_ + fVar217;
    auVar206._12_4_ = auVar90._12_4_ + fVar218;
    auVar206._16_4_ = auVar90._16_4_ + fVar219;
    auVar206._20_4_ = auVar90._20_4_ + fVar220;
    auVar206._24_4_ = auVar90._24_4_ + fVar221;
    auVar206._28_4_ = auVar90._28_4_ + auVar80._28_4_;
    auVar91 = vpermt2ps_avx512vl(auVar91,_DAT_01fb9fc0,ZEXT1632(auVar57));
    auVar80 = vaddps_avx512vl(auVar83,auVar75);
    auVar75 = vpermt2ps_avx512vl(auVar75,_DAT_01fb9fc0,ZEXT1632(auVar57));
    auVar91 = vsubps_avx(auVar79,auVar91);
    auVar75 = vsubps_avx512vl(auVar81,auVar75);
    auVar96 = ZEXT1632(auVar63);
    auVar82 = vsubps_avx512vl(auVar90,auVar96);
    auVar95 = ZEXT1632(auVar65);
    auVar84 = vsubps_avx512vl(auVar83,auVar95);
    auVar85 = vsubps_avx512vl(auVar79,auVar74);
    auVar82 = vaddps_avx512vl(auVar82,auVar85);
    auVar85 = vsubps_avx512vl(auVar81,auVar76);
    auVar84 = vaddps_avx512vl(auVar84,auVar85);
    auVar85 = vmulps_avx512vl(auVar95,auVar82);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar96,auVar84);
    auVar86 = vmulps_avx512vl(auVar78,auVar82);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar122,auVar84);
    auVar87 = vmulps_avx512vl(auVar77,auVar82);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar89,auVar84);
    auVar88 = vmulps_avx512vl(auVar76,auVar82);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar74,auVar84);
    auVar92 = vmulps_avx512vl(auVar83,auVar82);
    auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar90,auVar84);
    auVar93 = vmulps_avx512vl(auVar80,auVar82);
    auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar206,auVar84);
    auVar94 = vmulps_avx512vl(auVar75,auVar82);
    auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar91,auVar84);
    auVar82 = vmulps_avx512vl(auVar81,auVar82);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar79,auVar84);
    auVar84 = vminps_avx512vl(auVar85,auVar86);
    auVar85 = vmaxps_avx512vl(auVar85,auVar86);
    auVar86 = vminps_avx512vl(auVar87,auVar88);
    auVar84 = vminps_avx512vl(auVar84,auVar86);
    auVar86 = vmaxps_avx512vl(auVar87,auVar88);
    auVar85 = vmaxps_avx512vl(auVar85,auVar86);
    auVar86 = vminps_avx512vl(auVar92,auVar93);
    auVar87 = vmaxps_avx512vl(auVar92,auVar93);
    auVar88 = vminps_avx512vl(auVar94,auVar82);
    auVar86 = vminps_avx512vl(auVar86,auVar88);
    auVar84 = vminps_avx512vl(auVar84,auVar86);
    auVar82 = vmaxps_avx512vl(auVar94,auVar82);
    auVar82 = vmaxps_avx512vl(auVar87,auVar82);
    auVar82 = vmaxps_avx512vl(auVar85,auVar82);
    auVar51 = auVar82._0_16_;
    uVar18 = vcmpps_avx512vl(auVar84,local_240,2);
    uVar19 = vcmpps_avx512vl(auVar82,local_260,5);
    bVar30 = (byte)uVar18 & (byte)uVar19 & 0x7f;
    if (bVar30 != 0) {
      auVar82 = vsubps_avx512vl(auVar74,auVar96);
      auVar84 = vsubps_avx512vl(auVar76,auVar95);
      auVar85 = vsubps_avx512vl(auVar79,auVar90);
      auVar82 = vaddps_avx512vl(auVar82,auVar85);
      auVar51 = auVar82._0_16_;
      auVar85 = vsubps_avx512vl(auVar81,auVar83);
      auVar84 = vaddps_avx512vl(auVar84,auVar85);
      auVar85 = vmulps_avx512vl(auVar95,auVar82);
      auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar84,auVar96);
      auVar78 = vmulps_avx512vl(auVar78,auVar82);
      auVar78 = vfnmadd213ps_avx512vl(auVar122,auVar84,auVar78);
      auVar77 = vmulps_avx512vl(auVar77,auVar82);
      auVar77 = vfnmadd213ps_avx512vl(auVar89,auVar84,auVar77);
      auVar89 = vmulps_avx512vl(auVar76,auVar82);
      auVar76 = vfnmadd231ps_avx512vl(auVar89,auVar84,auVar74);
      auVar89 = vmulps_avx512vl(auVar83,auVar82);
      auVar83 = vfnmadd231ps_avx512vl(auVar89,auVar84,auVar90);
      auVar89 = vmulps_avx512vl(auVar80,auVar82);
      auVar80 = vfnmadd213ps_avx512vl(auVar206,auVar84,auVar89);
      auVar89 = vmulps_avx512vl(auVar75,auVar82);
      auVar86 = vfnmadd213ps_avx512vl(auVar91,auVar84,auVar89);
      auVar91 = vmulps_avx512vl(auVar81,auVar82);
      auVar79 = vfnmadd231ps_avx512vl(auVar91,auVar79,auVar84);
      auVar89 = vminps_avx(auVar85,auVar78);
      auVar91 = vmaxps_avx(auVar85,auVar78);
      auVar74 = vminps_avx(auVar77,auVar76);
      auVar74 = vminps_avx(auVar89,auVar74);
      auVar89 = vmaxps_avx(auVar77,auVar76);
      auVar91 = vmaxps_avx(auVar91,auVar89);
      auVar90 = vminps_avx(auVar83,auVar80);
      auVar89 = vmaxps_avx(auVar83,auVar80);
      auVar75 = vminps_avx(auVar86,auVar79);
      auVar90 = vminps_avx(auVar90,auVar75);
      auVar90 = vminps_avx(auVar74,auVar90);
      auVar74 = vmaxps_avx(auVar86,auVar79);
      auVar89 = vmaxps_avx(auVar89,auVar74);
      auVar91 = vmaxps_avx(auVar91,auVar89);
      uVar18 = vcmpps_avx512vl(auVar91,local_260,5);
      uVar19 = vcmpps_avx512vl(auVar90,local_240,2);
      bVar30 = bVar30 & (byte)uVar18 & (byte)uVar19;
      if (bVar30 != 0) {
        auStack_430[uVar32] = (uint)bVar30;
        uVar18 = vmovlps_avx(auVar58);
        (&uStack_220)[uVar32] = uVar18;
        uVar3 = vmovlps_avx(auVar44);
        auStack_1a0[uVar32] = uVar3;
        uVar32 = (ulong)((int)uVar32 + 1);
      }
    }
    auVar58 = vxorps_avx512vl(auVar51,auVar51);
    auVar253 = ZEXT1664(auVar58);
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar257 = ZEXT1664(auVar58);
    auVar91 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar254 = ZEXT3264(auVar91);
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar255 = ZEXT1664(auVar58);
    auVar256 = ZEXT3264(_DAT_01fb9fe0);
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar260 = ZEXT1664(auVar58);
LAB_018c17a6:
    do {
      do {
        do {
          auVar51 = auVar253._0_16_;
          auVar52 = auVar257._0_16_;
          if ((int)uVar32 == 0) {
            uVar106 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar23._4_4_ = uVar106;
            auVar23._0_4_ = uVar106;
            auVar23._8_4_ = uVar106;
            auVar23._12_4_ = uVar106;
            uVar18 = vcmpps_avx512vl(local_400,auVar23,2);
            uVar38 = (ulong)((uint)uVar38 & (uint)uVar38 + 0xf & (uint)uVar18);
            goto LAB_018c07a1;
          }
          uVar31 = (int)uVar32 - 1;
          uVar33 = (ulong)uVar31;
          uVar8 = auStack_430[uVar33];
          auVar44._8_8_ = 0;
          auVar44._0_8_ = auStack_1a0[uVar33];
          uVar3 = 0;
          for (uVar37 = (ulong)uVar8; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000)
          {
            uVar3 = uVar3 + 1;
          }
          uVar34 = uVar8 - 1 & uVar8;
          bVar41 = uVar34 == 0;
          auStack_430[uVar33] = uVar34;
          if (bVar41) {
            uVar32 = (ulong)uVar31;
          }
          auVar109._8_8_ = 0;
          auVar109._0_8_ = uVar3;
          auVar58 = vpunpcklqdq_avx(auVar109,ZEXT416((int)uVar3 + 1));
          auVar58 = vcvtqq2ps_avx512vl(auVar58);
          auVar58 = vmulps_avx512vl(auVar58,auVar255._0_16_);
          uVar106 = *(undefined4 *)((long)&uStack_220 + uVar33 * 8 + 4);
          auVar20._4_4_ = uVar106;
          auVar20._0_4_ = uVar106;
          auVar20._8_4_ = uVar106;
          auVar20._12_4_ = uVar106;
          auVar57 = vmulps_avx512vl(auVar58,auVar20);
          auVar124._8_4_ = 0x3f800000;
          auVar124._0_8_ = 0x3f8000003f800000;
          auVar124._12_4_ = 0x3f800000;
          auVar58 = vsubps_avx(auVar124,auVar58);
          uVar106 = *(undefined4 *)(&uStack_220 + uVar33);
          auVar21._4_4_ = uVar106;
          auVar21._0_4_ = uVar106;
          auVar21._8_4_ = uVar106;
          auVar21._12_4_ = uVar106;
          auVar58 = vfmadd231ps_avx512vl(auVar57,auVar58,auVar21);
          auVar57 = vmovshdup_avx(auVar58);
          fVar221 = auVar57._0_4_ - auVar58._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar221));
          if (uVar8 == 0 || bVar41) goto LAB_018c12a6;
          auVar57 = vshufps_avx(auVar44,auVar44,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar221));
          auVar134._8_4_ = 0x3f800000;
          auVar134._0_8_ = 0x3f8000003f800000;
          auVar134._12_4_ = 0x3f800000;
          auVar60 = vsubps_avx(auVar134,auVar57);
          fVar207 = auVar57._0_4_;
          auVar145._0_4_ = fVar207 * fVar130;
          fVar216 = auVar57._4_4_;
          auVar145._4_4_ = fVar216 * fVar138;
          fVar217 = auVar57._8_4_;
          auVar145._8_4_ = fVar217 * fVar130;
          fVar218 = auVar57._12_4_;
          auVar145._12_4_ = fVar218 * fVar138;
          auVar161._0_4_ = fVar207 * fVar139;
          auVar161._4_4_ = fVar216 * fVar151;
          auVar161._8_4_ = fVar217 * fVar139;
          auVar161._12_4_ = fVar218 * fVar151;
          auVar170._0_4_ = fVar207 * fVar153;
          auVar170._4_4_ = fVar216 * fVar166;
          auVar170._8_4_ = fVar217 * fVar153;
          auVar170._12_4_ = fVar218 * fVar166;
          auVar125._0_4_ = fVar207 * fVar167;
          auVar125._4_4_ = fVar216 * fVar174;
          auVar125._8_4_ = fVar217 * fVar167;
          auVar125._12_4_ = fVar218 * fVar174;
          auVar57 = vfmadd231ps_fma(auVar145,auVar60,auVar61);
          auVar64 = vfmadd231ps_fma(auVar161,auVar60,auVar49);
          auVar63 = vfmadd231ps_fma(auVar170,auVar60,auVar48);
          auVar60 = vfmadd231ps_fma(auVar125,auVar60,auVar50);
          auVar81._16_16_ = auVar57;
          auVar81._0_16_ = auVar57;
          auVar82._16_16_ = auVar64;
          auVar82._0_16_ = auVar64;
          auVar84._16_16_ = auVar63;
          auVar84._0_16_ = auVar63;
          auVar89 = vpermps_avx512vl(auVar256._0_32_,ZEXT1632(auVar58));
          auVar91 = vsubps_avx(auVar82,auVar81);
          auVar64 = vfmadd213ps_fma(auVar91,auVar89,auVar81);
          auVar91 = vsubps_avx(auVar84,auVar82);
          auVar65 = vfmadd213ps_fma(auVar91,auVar89,auVar82);
          auVar57 = vsubps_avx(auVar60,auVar63);
          auVar83._16_16_ = auVar57;
          auVar83._0_16_ = auVar57;
          auVar57 = vfmadd213ps_fma(auVar83,auVar89,auVar84);
          auVar91 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar64));
          auVar60 = vfmadd213ps_fma(auVar91,auVar89,ZEXT1632(auVar64));
          auVar91 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar65));
          auVar57 = vfmadd213ps_fma(auVar91,auVar89,ZEXT1632(auVar65));
          auVar91 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar60));
          auVar62 = vfmadd231ps_fma(ZEXT1632(auVar60),auVar91,auVar89);
          auVar91 = vmulps_avx512vl(auVar91,auVar254._0_32_);
          auVar78._16_16_ = auVar91._16_16_;
          auVar57 = vmulss_avx512f(ZEXT416((uint)fVar221),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar207 = auVar57._0_4_;
          auVar171._0_8_ =
               CONCAT44(auVar62._4_4_ + fVar207 * auVar91._4_4_,
                        auVar62._0_4_ + fVar207 * auVar91._0_4_);
          auVar171._8_4_ = auVar62._8_4_ + fVar207 * auVar91._8_4_;
          auVar171._12_4_ = auVar62._12_4_ + fVar207 * auVar91._12_4_;
          auVar146._0_4_ = fVar207 * auVar91._16_4_;
          auVar146._4_4_ = fVar207 * auVar91._20_4_;
          auVar146._8_4_ = fVar207 * auVar91._24_4_;
          auVar146._12_4_ = fVar207 * auVar91._28_4_;
          auVar46 = vsubps_avx((undefined1  [16])0x0,auVar146);
          auVar65 = vshufpd_avx(auVar62,auVar62,3);
          auVar66 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar57 = vsubps_avx(auVar65,auVar62);
          auVar60 = vsubps_avx(auVar66,(undefined1  [16])0x0);
          auVar193._0_4_ = auVar57._0_4_ + auVar60._0_4_;
          auVar193._4_4_ = auVar57._4_4_ + auVar60._4_4_;
          auVar193._8_4_ = auVar57._8_4_ + auVar60._8_4_;
          auVar193._12_4_ = auVar57._12_4_ + auVar60._12_4_;
          auVar57 = vshufps_avx(auVar62,auVar62,0xb1);
          auVar60 = vshufps_avx(auVar171,auVar171,0xb1);
          auVar64 = vshufps_avx(auVar46,auVar46,0xb1);
          auVar63 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar242._4_4_ = auVar193._0_4_;
          auVar242._0_4_ = auVar193._0_4_;
          auVar242._8_4_ = auVar193._0_4_;
          auVar242._12_4_ = auVar193._0_4_;
          auVar43 = vshufps_avx(auVar193,auVar193,0x55);
          fVar207 = auVar43._0_4_;
          auVar204._0_4_ = auVar57._0_4_ * fVar207;
          fVar216 = auVar43._4_4_;
          auVar204._4_4_ = auVar57._4_4_ * fVar216;
          fVar217 = auVar43._8_4_;
          auVar204._8_4_ = auVar57._8_4_ * fVar217;
          fVar218 = auVar43._12_4_;
          auVar204._12_4_ = auVar57._12_4_ * fVar218;
          auVar209._0_4_ = auVar60._0_4_ * fVar207;
          auVar209._4_4_ = auVar60._4_4_ * fVar216;
          auVar209._8_4_ = auVar60._8_4_ * fVar217;
          auVar209._12_4_ = auVar60._12_4_ * fVar218;
          auVar226._0_4_ = auVar64._0_4_ * fVar207;
          auVar226._4_4_ = auVar64._4_4_ * fVar216;
          auVar226._8_4_ = auVar64._8_4_ * fVar217;
          auVar226._12_4_ = auVar64._12_4_ * fVar218;
          auVar194._0_4_ = auVar63._0_4_ * fVar207;
          auVar194._4_4_ = auVar63._4_4_ * fVar216;
          auVar194._8_4_ = auVar63._8_4_ * fVar217;
          auVar194._12_4_ = auVar63._12_4_ * fVar218;
          auVar57 = vfmadd231ps_fma(auVar204,auVar242,auVar62);
          auVar60 = vfmadd231ps_fma(auVar209,auVar242,auVar171);
          auVar47 = vfmadd231ps_fma(auVar226,auVar242,auVar46);
          auVar71 = vfmadd231ps_fma(auVar194,(undefined1  [16])0x0,auVar242);
          auVar43 = vshufpd_avx(auVar57,auVar57,1);
          auVar45 = vshufpd_avx(auVar60,auVar60,1);
          auVar69 = vshufpd_avx512vl(auVar47,auVar47,1);
          auVar70 = vshufpd_avx512vl(auVar71,auVar71,1);
          auVar64 = vminss_avx(auVar57,auVar60);
          auVar57 = vmaxss_avx(auVar60,auVar57);
          auVar63 = vminss_avx(auVar47,auVar71);
          auVar60 = vmaxss_avx(auVar71,auVar47);
          auVar64 = vminss_avx(auVar64,auVar63);
          auVar57 = vmaxss_avx(auVar60,auVar57);
          auVar63 = vminss_avx(auVar43,auVar45);
          auVar60 = vmaxss_avx(auVar45,auVar43);
          auVar43 = vminss_avx512f(auVar69,auVar70);
          auVar45 = vmaxss_avx512f(auVar70,auVar69);
          auVar60 = vmaxss_avx(auVar45,auVar60);
          auVar63 = vminss_avx512f(auVar63,auVar43);
          vucomiss_avx512f(auVar64);
          fVar216 = auVar60._0_4_;
          fVar207 = auVar57._0_4_;
          if (4 < (uint)uVar32) {
            bVar42 = fVar216 == -0.0001;
            bVar39 = NAN(fVar216);
            if (fVar216 <= -0.0001) goto LAB_018c19dc;
            break;
          }
LAB_018c19dc:
          auVar43 = vucomiss_avx512f(auVar63);
          bVar42 = fVar216 <= -0.0001;
          bVar40 = -0.0001 < fVar207;
          bVar39 = bVar42;
          if (!bVar42) break;
          uVar18 = vcmpps_avx512vl(auVar64,auVar43,5);
          uVar19 = vcmpps_avx512vl(auVar63,auVar43,5);
          bVar30 = (byte)uVar18 & (byte)uVar19 & 1;
          bVar42 = bVar40 && bVar30 == 0;
          bVar39 = bVar40 && bVar30 == 0;
        } while (!bVar40 || bVar30 != 0);
        vcmpss_avx512f(auVar64,auVar51,1);
        auVar47 = auVar259._0_16_;
        uVar18 = vcmpss_avx512f(auVar57,auVar51,1);
        bVar40 = (bool)((byte)uVar18 & 1);
        auVar78._0_16_ = auVar47;
        iVar105 = auVar259._0_4_;
        auVar85._4_28_ = auVar78._4_28_;
        auVar85._0_4_ = (float)((uint)bVar40 * -0x40800000 + (uint)!bVar40 * iVar105);
        vucomiss_avx512f(auVar85._0_16_);
        bVar39 = (bool)(!bVar42 | bVar39);
        bVar40 = bVar39 == false;
        auVar96._16_16_ = auVar78._16_16_;
        auVar96._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar95._4_28_ = auVar96._4_28_;
        auVar95._0_4_ = (uint)bVar39 * auVar253._0_4_ + (uint)!bVar39 * 0x7f800000;
        auVar45 = auVar95._0_16_;
        auVar98._16_16_ = auVar78._16_16_;
        auVar98._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar97._4_28_ = auVar98._4_28_;
        auVar97._0_4_ = (uint)bVar39 * auVar253._0_4_ + (uint)!bVar39 * -0x800000;
        auVar43 = auVar97._0_16_;
        uVar18 = vcmpss_avx512f(auVar63,auVar51,1);
        bVar42 = (bool)((byte)uVar18 & 1);
        auVar100._16_16_ = auVar78._16_16_;
        auVar100._0_16_ = auVar47;
        auVar99._4_28_ = auVar100._4_28_;
        auVar99._0_4_ = (float)((uint)bVar42 * -0x40800000 + (uint)!bVar42 * iVar105);
        vucomiss_avx512f(auVar99._0_16_);
        if ((bVar39) || (bVar40)) {
          auVar63 = vucomiss_avx512f(auVar64);
          if ((bVar39) || (bVar40)) {
            auVar71 = vxorps_avx512vl(auVar64,auVar260._0_16_);
            auVar64 = vsubss_avx512f(auVar63,auVar64);
            auVar64 = vdivss_avx512f(auVar71,auVar64);
            auVar63 = vsubss_avx512f(auVar47,auVar64);
            auVar64 = vfmadd213ss_avx512f(auVar63,auVar51,auVar64);
            auVar63 = auVar64;
          }
          else {
            auVar63 = vxorps_avx512vl(auVar63,auVar63);
            vucomiss_avx512f(auVar63);
            if ((bVar39) || (auVar64 = auVar47, bVar40)) {
              auVar64 = SUB6416(ZEXT464(0xff800000),0);
              auVar63 = ZEXT416(0x7f800000);
            }
          }
          auVar45 = vminss_avx512f(auVar45,auVar63);
          auVar43 = vmaxss_avx(auVar64,auVar43);
        }
        uVar18 = vcmpss_avx512f(auVar60,auVar51,1);
        bVar42 = (bool)((byte)uVar18 & 1);
        fVar217 = (float)((uint)bVar42 * -0x40800000 + (uint)!bVar42 * iVar105);
        if ((auVar85._0_4_ != fVar217) || (NAN(auVar85._0_4_) || NAN(fVar217))) {
          if ((fVar216 != fVar207) || (NAN(fVar216) || NAN(fVar207))) {
            auVar57 = vxorps_avx512vl(auVar57,auVar260._0_16_);
            auVar195._0_4_ = auVar57._0_4_ / (fVar216 - fVar207);
            auVar195._4_12_ = auVar57._4_12_;
            auVar57 = vsubss_avx512f(auVar47,auVar195);
            auVar57 = vfmadd213ss_avx512f(auVar57,auVar51,auVar195);
            auVar60 = auVar57;
          }
          else if ((fVar207 != 0.0) ||
                  (auVar57 = auVar47, auVar60 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar207))) {
            auVar57 = SUB6416(ZEXT464(0xff800000),0);
            auVar60 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar45 = vminss_avx(auVar45,auVar60);
          auVar43 = vmaxss_avx(auVar57,auVar43);
        }
        bVar42 = auVar99._0_4_ != fVar217;
        auVar57 = vminss_avx512f(auVar45,auVar47);
        auVar102._16_16_ = auVar78._16_16_;
        auVar102._0_16_ = auVar45;
        auVar101._4_28_ = auVar102._4_28_;
        auVar101._0_4_ = (uint)bVar42 * auVar57._0_4_ + (uint)!bVar42 * auVar45._0_4_;
        auVar57 = vmaxss_avx512f(auVar47,auVar43);
        auVar104._16_16_ = auVar78._16_16_;
        auVar104._0_16_ = auVar43;
        auVar103._4_28_ = auVar104._4_28_;
        auVar103._0_4_ = (uint)bVar42 * auVar57._0_4_ + (uint)!bVar42 * auVar43._0_4_;
        auVar57 = vmaxss_avx512f(auVar51,auVar101._0_16_);
        auVar60 = vminss_avx512f(auVar103._0_16_,auVar47);
      } while (auVar60._0_4_ < auVar57._0_4_);
      auVar71 = vmaxss_avx512f(auVar51,ZEXT416((uint)(auVar57._0_4_ + -0.1)));
      auVar69 = vminss_avx512f(ZEXT416((uint)(auVar60._0_4_ + 0.1)),auVar47);
      auVar126._0_8_ = auVar62._0_8_;
      auVar126._8_8_ = auVar126._0_8_;
      auVar210._8_8_ = auVar171._0_8_;
      auVar210._0_8_ = auVar171._0_8_;
      auVar227._8_8_ = auVar46._0_8_;
      auVar227._0_8_ = auVar46._0_8_;
      auVar57 = vshufpd_avx(auVar171,auVar171,3);
      auVar60 = vshufpd_avx(auVar46,auVar46,3);
      auVar64 = vshufps_avx(auVar71,auVar69,0);
      auVar243._8_4_ = 0x3f800000;
      auVar243._0_8_ = 0x3f8000003f800000;
      auVar243._12_4_ = 0x3f800000;
      auVar63 = vsubps_avx(auVar243,auVar64);
      fVar207 = auVar64._0_4_;
      auVar162._0_4_ = fVar207 * auVar65._0_4_;
      fVar216 = auVar64._4_4_;
      auVar162._4_4_ = fVar216 * auVar65._4_4_;
      fVar217 = auVar64._8_4_;
      auVar162._8_4_ = fVar217 * auVar65._8_4_;
      fVar218 = auVar64._12_4_;
      auVar162._12_4_ = fVar218 * auVar65._12_4_;
      auVar172._0_4_ = fVar207 * auVar57._0_4_;
      auVar172._4_4_ = fVar216 * auVar57._4_4_;
      auVar172._8_4_ = fVar217 * auVar57._8_4_;
      auVar172._12_4_ = fVar218 * auVar57._12_4_;
      auVar248._0_4_ = auVar60._0_4_ * fVar207;
      auVar248._4_4_ = auVar60._4_4_ * fVar216;
      auVar248._8_4_ = auVar60._8_4_ * fVar217;
      auVar248._12_4_ = auVar60._12_4_ * fVar218;
      auVar147._0_4_ = fVar207 * auVar66._0_4_;
      auVar147._4_4_ = fVar216 * auVar66._4_4_;
      auVar147._8_4_ = fVar217 * auVar66._8_4_;
      auVar147._12_4_ = fVar218 * auVar66._12_4_;
      auVar65 = vfmadd231ps_fma(auVar162,auVar63,auVar126);
      auVar66 = vfmadd231ps_fma(auVar172,auVar63,auVar210);
      auVar43 = vfmadd231ps_fma(auVar248,auVar63,auVar227);
      auVar45 = vfmadd231ps_fma(auVar147,auVar63,ZEXT816(0));
      auVar60 = vsubss_avx512f(auVar47,auVar71);
      auVar57 = vmovshdup_avx(auVar44);
      auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * auVar71._0_4_)),auVar44,auVar60);
      auVar60 = vsubss_avx512f(auVar47,auVar69);
      auVar69 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * auVar69._0_4_)),auVar44,auVar60);
      auVar44 = vdivss_avx512f(auVar47,ZEXT416((uint)fVar221));
      auVar57 = vsubps_avx(auVar66,auVar65);
      auVar64 = vmulps_avx512vl(auVar57,auVar52);
      auVar57 = vsubps_avx(auVar43,auVar66);
      auVar63 = vmulps_avx512vl(auVar57,auVar52);
      auVar57 = vsubps_avx(auVar45,auVar43);
      auVar57 = vmulps_avx512vl(auVar57,auVar52);
      auVar60 = vminps_avx(auVar63,auVar57);
      auVar57 = vmaxps_avx(auVar63,auVar57);
      auVar60 = vminps_avx(auVar64,auVar60);
      auVar57 = vmaxps_avx(auVar64,auVar57);
      auVar64 = vshufpd_avx(auVar60,auVar60,3);
      auVar63 = vshufpd_avx(auVar57,auVar57,3);
      auVar60 = vminps_avx(auVar60,auVar64);
      auVar57 = vmaxps_avx(auVar57,auVar63);
      fVar221 = auVar44._0_4_;
      auVar196._0_4_ = auVar60._0_4_ * fVar221;
      auVar196._4_4_ = auVar60._4_4_ * fVar221;
      auVar196._8_4_ = auVar60._8_4_ * fVar221;
      auVar196._12_4_ = auVar60._12_4_ * fVar221;
      auVar183._0_4_ = fVar221 * auVar57._0_4_;
      auVar183._4_4_ = fVar221 * auVar57._4_4_;
      auVar183._8_4_ = fVar221 * auVar57._8_4_;
      auVar183._12_4_ = fVar221 * auVar57._12_4_;
      auVar44 = vdivss_avx512f(auVar47,ZEXT416((uint)(auVar69._0_4_ - auVar62._0_4_)));
      auVar57 = vshufpd_avx(auVar65,auVar65,3);
      auVar60 = vshufpd_avx(auVar66,auVar66,3);
      auVar64 = vshufpd_avx(auVar43,auVar43,3);
      auVar63 = vshufpd_avx(auVar45,auVar45,3);
      auVar57 = vsubps_avx(auVar57,auVar65);
      auVar65 = vsubps_avx(auVar60,auVar66);
      auVar66 = vsubps_avx(auVar64,auVar43);
      auVar63 = vsubps_avx(auVar63,auVar45);
      auVar60 = vminps_avx(auVar57,auVar65);
      auVar57 = vmaxps_avx(auVar57,auVar65);
      auVar64 = vminps_avx(auVar66,auVar63);
      auVar64 = vminps_avx(auVar60,auVar64);
      auVar60 = vmaxps_avx(auVar66,auVar63);
      auVar57 = vmaxps_avx(auVar57,auVar60);
      fVar221 = auVar44._0_4_;
      auVar228._0_4_ = fVar221 * auVar64._0_4_;
      auVar228._4_4_ = fVar221 * auVar64._4_4_;
      auVar228._8_4_ = fVar221 * auVar64._8_4_;
      auVar228._12_4_ = fVar221 * auVar64._12_4_;
      auVar211._0_4_ = fVar221 * auVar57._0_4_;
      auVar211._4_4_ = fVar221 * auVar57._4_4_;
      auVar211._8_4_ = fVar221 * auVar57._8_4_;
      auVar211._12_4_ = fVar221 * auVar57._12_4_;
      auVar63 = vinsertps_avx(auVar58,auVar62,0x10);
      auVar70 = vpermt2ps_avx512vl(auVar58,_DAT_01fb9f90,auVar69);
      auVar116._0_4_ = auVar63._0_4_ + auVar70._0_4_;
      auVar116._4_4_ = auVar63._4_4_ + auVar70._4_4_;
      auVar116._8_4_ = auVar63._8_4_ + auVar70._8_4_;
      auVar116._12_4_ = auVar63._12_4_ + auVar70._12_4_;
      auVar22._8_4_ = 0x3f000000;
      auVar22._0_8_ = 0x3f0000003f000000;
      auVar22._12_4_ = 0x3f000000;
      auVar45 = vmulps_avx512vl(auVar116,auVar22);
      auVar60 = vshufps_avx(auVar45,auVar45,0x54);
      uVar106 = auVar45._0_4_;
      auVar120._4_4_ = uVar106;
      auVar120._0_4_ = uVar106;
      auVar120._8_4_ = uVar106;
      auVar120._12_4_ = uVar106;
      auVar64 = vfmadd213ps_fma(local_270,auVar120,auVar67);
      auVar65 = vfmadd213ps_fma(local_280,auVar120,auVar59);
      auVar66 = vfmadd213ps_fma(local_290,auVar120,auVar68);
      auVar57 = vsubps_avx(auVar65,auVar64);
      auVar64 = vfmadd213ps_fma(auVar57,auVar120,auVar64);
      auVar57 = vsubps_avx(auVar66,auVar65);
      auVar57 = vfmadd213ps_fma(auVar57,auVar120,auVar65);
      auVar57 = vsubps_avx(auVar57,auVar64);
      auVar64 = vfmadd231ps_fma(auVar64,auVar57,auVar120);
      auVar43 = vmulps_avx512vl(auVar57,auVar52);
      auVar237._8_8_ = auVar64._0_8_;
      auVar237._0_8_ = auVar64._0_8_;
      auVar57 = vshufpd_avx(auVar64,auVar64,3);
      auVar64 = vshufps_avx(auVar45,auVar45,0x55);
      auVar65 = vsubps_avx(auVar57,auVar237);
      auVar66 = vfmadd231ps_fma(auVar237,auVar64,auVar65);
      auVar249._8_8_ = auVar43._0_8_;
      auVar249._0_8_ = auVar43._0_8_;
      auVar57 = vshufpd_avx(auVar43,auVar43,3);
      auVar57 = vsubps_avx512vl(auVar57,auVar249);
      auVar57 = vfmadd213ps_avx512vl(auVar57,auVar64,auVar249);
      auVar121._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
      auVar121._8_4_ = auVar65._8_4_ ^ 0x80000000;
      auVar121._12_4_ = auVar65._12_4_ ^ 0x80000000;
      auVar64 = vmovshdup_avx512vl(auVar57);
      auVar250._0_8_ = auVar64._0_8_ ^ 0x8000000080000000;
      auVar250._8_4_ = auVar64._8_4_ ^ 0x80000000;
      auVar250._12_4_ = auVar64._12_4_ ^ 0x80000000;
      auVar43 = vmovshdup_avx512vl(auVar65);
      auVar44 = vpermt2ps_avx512vl(auVar250,ZEXT416(5),auVar65);
      auVar64 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar64._0_4_ * auVar65._0_4_)),auVar57,auVar43);
      auVar65 = vpermt2ps_avx512vl(auVar57,SUB6416(ZEXT464(4),0),auVar121);
      auVar148._0_4_ = auVar64._0_4_;
      auVar148._4_4_ = auVar148._0_4_;
      auVar148._8_4_ = auVar148._0_4_;
      auVar148._12_4_ = auVar148._0_4_;
      auVar57 = vdivps_avx(auVar44,auVar148);
      auVar72 = vdivps_avx512vl(auVar65,auVar148);
      fVar221 = auVar66._0_4_;
      auVar64 = vshufps_avx(auVar66,auVar66,0x55);
      auVar238._0_4_ = fVar221 * auVar57._0_4_ + auVar64._0_4_ * auVar72._0_4_;
      auVar238._4_4_ = fVar221 * auVar57._4_4_ + auVar64._4_4_ * auVar72._4_4_;
      auVar238._8_4_ = fVar221 * auVar57._8_4_ + auVar64._8_4_ * auVar72._8_4_;
      auVar238._12_4_ = fVar221 * auVar57._12_4_ + auVar64._12_4_ * auVar72._12_4_;
      auVar46 = vsubps_avx(auVar60,auVar238);
      auVar64 = vmovshdup_avx(auVar57);
      auVar60 = vinsertps_avx(auVar196,auVar228,0x1c);
      auVar251._0_4_ = auVar64._0_4_ * auVar60._0_4_;
      auVar251._4_4_ = auVar64._4_4_ * auVar60._4_4_;
      auVar251._8_4_ = auVar64._8_4_ * auVar60._8_4_;
      auVar251._12_4_ = auVar64._12_4_ * auVar60._12_4_;
      auVar71 = vinsertps_avx512f(auVar183,auVar211,0x1c);
      auVar64 = vmulps_avx512vl(auVar64,auVar71);
      auVar44 = vminps_avx512vl(auVar251,auVar64);
      auVar66 = vmaxps_avx(auVar64,auVar251);
      auVar43 = vmovshdup_avx(auVar72);
      auVar64 = vinsertps_avx(auVar228,auVar196,0x4c);
      auVar229._0_4_ = auVar43._0_4_ * auVar64._0_4_;
      auVar229._4_4_ = auVar43._4_4_ * auVar64._4_4_;
      auVar229._8_4_ = auVar43._8_4_ * auVar64._8_4_;
      auVar229._12_4_ = auVar43._12_4_ * auVar64._12_4_;
      auVar65 = vinsertps_avx(auVar211,auVar183,0x4c);
      auVar212._0_4_ = auVar43._0_4_ * auVar65._0_4_;
      auVar212._4_4_ = auVar43._4_4_ * auVar65._4_4_;
      auVar212._8_4_ = auVar43._8_4_ * auVar65._8_4_;
      auVar212._12_4_ = auVar43._12_4_ * auVar65._12_4_;
      auVar43 = vminps_avx(auVar229,auVar212);
      auVar44 = vaddps_avx512vl(auVar44,auVar43);
      auVar43 = vmaxps_avx(auVar212,auVar229);
      auVar213._0_4_ = auVar66._0_4_ + auVar43._0_4_;
      auVar213._4_4_ = auVar66._4_4_ + auVar43._4_4_;
      auVar213._8_4_ = auVar66._8_4_ + auVar43._8_4_;
      auVar213._12_4_ = auVar66._12_4_ + auVar43._12_4_;
      auVar230._8_8_ = 0x3f80000000000000;
      auVar230._0_8_ = 0x3f80000000000000;
      auVar66 = vsubps_avx(auVar230,auVar213);
      auVar43 = vsubps_avx(auVar230,auVar44);
      auVar44 = vsubps_avx(auVar63,auVar45);
      auVar45 = vsubps_avx(auVar70,auVar45);
      fVar218 = auVar44._0_4_;
      auVar252._0_4_ = fVar218 * auVar66._0_4_;
      fVar219 = auVar44._4_4_;
      auVar252._4_4_ = fVar219 * auVar66._4_4_;
      fVar220 = auVar44._8_4_;
      auVar252._8_4_ = fVar220 * auVar66._8_4_;
      fVar175 = auVar44._12_4_;
      auVar252._12_4_ = fVar175 * auVar66._12_4_;
      auVar73 = vbroadcastss_avx512vl(auVar57);
      auVar60 = vmulps_avx512vl(auVar73,auVar60);
      auVar71 = vmulps_avx512vl(auVar73,auVar71);
      auVar73 = vminps_avx512vl(auVar60,auVar71);
      auVar71 = vmaxps_avx512vl(auVar71,auVar60);
      auVar60 = vbroadcastss_avx512vl(auVar72);
      auVar64 = vmulps_avx512vl(auVar60,auVar64);
      auVar60 = vmulps_avx512vl(auVar60,auVar65);
      auVar65 = vminps_avx512vl(auVar64,auVar60);
      auVar65 = vaddps_avx512vl(auVar73,auVar65);
      auVar44 = vmulps_avx512vl(auVar44,auVar43);
      fVar221 = auVar45._0_4_;
      auVar214._0_4_ = fVar221 * auVar66._0_4_;
      fVar207 = auVar45._4_4_;
      auVar214._4_4_ = fVar207 * auVar66._4_4_;
      fVar216 = auVar45._8_4_;
      auVar214._8_4_ = fVar216 * auVar66._8_4_;
      fVar217 = auVar45._12_4_;
      auVar214._12_4_ = fVar217 * auVar66._12_4_;
      auVar231._0_4_ = fVar221 * auVar43._0_4_;
      auVar231._4_4_ = fVar207 * auVar43._4_4_;
      auVar231._8_4_ = fVar216 * auVar43._8_4_;
      auVar231._12_4_ = fVar217 * auVar43._12_4_;
      auVar60 = vmaxps_avx(auVar60,auVar64);
      auVar184._0_4_ = auVar71._0_4_ + auVar60._0_4_;
      auVar184._4_4_ = auVar71._4_4_ + auVar60._4_4_;
      auVar184._8_4_ = auVar71._8_4_ + auVar60._8_4_;
      auVar184._12_4_ = auVar71._12_4_ + auVar60._12_4_;
      auVar197._8_8_ = 0x3f800000;
      auVar197._0_8_ = 0x3f800000;
      auVar60 = vsubps_avx(auVar197,auVar184);
      auVar64 = vsubps_avx512vl(auVar197,auVar65);
      auVar244._0_4_ = fVar218 * auVar60._0_4_;
      auVar244._4_4_ = fVar219 * auVar60._4_4_;
      auVar244._8_4_ = fVar220 * auVar60._8_4_;
      auVar244._12_4_ = fVar175 * auVar60._12_4_;
      auVar239._0_4_ = fVar218 * auVar64._0_4_;
      auVar239._4_4_ = fVar219 * auVar64._4_4_;
      auVar239._8_4_ = fVar220 * auVar64._8_4_;
      auVar239._12_4_ = fVar175 * auVar64._12_4_;
      auVar185._0_4_ = fVar221 * auVar60._0_4_;
      auVar185._4_4_ = fVar207 * auVar60._4_4_;
      auVar185._8_4_ = fVar216 * auVar60._8_4_;
      auVar185._12_4_ = fVar217 * auVar60._12_4_;
      auVar198._0_4_ = fVar221 * auVar64._0_4_;
      auVar198._4_4_ = fVar207 * auVar64._4_4_;
      auVar198._8_4_ = fVar216 * auVar64._8_4_;
      auVar198._12_4_ = fVar217 * auVar64._12_4_;
      auVar60 = vminps_avx(auVar244,auVar239);
      auVar64 = vminps_avx512vl(auVar185,auVar198);
      auVar65 = vminps_avx512vl(auVar60,auVar64);
      auVar60 = vmaxps_avx(auVar239,auVar244);
      auVar64 = vmaxps_avx(auVar198,auVar185);
      auVar64 = vmaxps_avx(auVar64,auVar60);
      auVar66 = vminps_avx512vl(auVar252,auVar44);
      auVar60 = vminps_avx(auVar214,auVar231);
      auVar60 = vminps_avx(auVar66,auVar60);
      auVar60 = vhaddps_avx(auVar65,auVar60);
      auVar66 = vmaxps_avx512vl(auVar44,auVar252);
      auVar65 = vmaxps_avx(auVar231,auVar214);
      auVar65 = vmaxps_avx(auVar65,auVar66);
      auVar64 = vhaddps_avx(auVar64,auVar65);
      auVar60 = vshufps_avx(auVar60,auVar60,0xe8);
      auVar64 = vshufps_avx(auVar64,auVar64,0xe8);
      auVar186._0_4_ = auVar60._0_4_ + auVar46._0_4_;
      auVar186._4_4_ = auVar60._4_4_ + auVar46._4_4_;
      auVar186._8_4_ = auVar60._8_4_ + auVar46._8_4_;
      auVar186._12_4_ = auVar60._12_4_ + auVar46._12_4_;
      auVar199._0_4_ = auVar64._0_4_ + auVar46._0_4_;
      auVar199._4_4_ = auVar64._4_4_ + auVar46._4_4_;
      auVar199._8_4_ = auVar64._8_4_ + auVar46._8_4_;
      auVar199._12_4_ = auVar64._12_4_ + auVar46._12_4_;
      auVar60 = vmaxps_avx(auVar63,auVar186);
      auVar64 = vminps_avx(auVar199,auVar70);
      uVar3 = vcmpps_avx512vl(auVar64,auVar60,1);
    } while ((uVar3 & 3) != 0);
    uVar3 = vcmpps_avx512vl(auVar199,auVar70,1);
    uVar18 = vcmpps_avx512vl(auVar58,auVar186,1);
    if (((ushort)uVar18 & (ushort)uVar3 & 1) == 0) {
      bVar30 = 0;
    }
    else {
      auVar60 = vmovshdup_avx(auVar186);
      bVar30 = auVar62._0_4_ < auVar60._0_4_ & (byte)(uVar3 >> 1) & 0x7f;
    }
    if (((3 < (uint)uVar32 || uVar8 != 0 && !bVar41) | bVar30) == 1) {
      lVar35 = 0xc9;
      do {
        lVar35 = lVar35 + -1;
        if (lVar35 == 0) goto LAB_018c17a6;
        auVar58 = vsubss_avx512f(auVar47,auVar46);
        fVar216 = auVar58._0_4_;
        fVar221 = fVar216 * fVar216 * fVar216;
        auVar58 = vmulss_avx512f(auVar46,ZEXT416(0x40400000));
        fVar207 = auVar58._0_4_ * fVar216 * fVar216;
        fVar217 = auVar46._0_4_;
        auVar58 = vmulss_avx512f(ZEXT416((uint)(fVar217 * fVar217)),ZEXT416(0x40400000));
        fVar216 = fVar216 * auVar58._0_4_;
        auVar135._4_4_ = fVar221;
        auVar135._0_4_ = fVar221;
        auVar135._8_4_ = fVar221;
        auVar135._12_4_ = fVar221;
        auVar127._4_4_ = fVar207;
        auVar127._0_4_ = fVar207;
        auVar127._8_4_ = fVar207;
        auVar127._12_4_ = fVar207;
        auVar110._4_4_ = fVar216;
        auVar110._0_4_ = fVar216;
        auVar110._8_4_ = fVar216;
        auVar110._12_4_ = fVar216;
        fVar217 = fVar217 * fVar217 * fVar217;
        auVar163._0_4_ = (float)local_2a0._0_4_ * fVar217;
        auVar163._4_4_ = (float)local_2a0._4_4_ * fVar217;
        auVar163._8_4_ = fStack_298 * fVar217;
        auVar163._12_4_ = fStack_294 * fVar217;
        auVar58 = vfmadd231ps_fma(auVar163,auVar68,auVar110);
        auVar58 = vfmadd231ps_fma(auVar58,auVar59,auVar127);
        auVar58 = vfmadd231ps_fma(auVar58,auVar67,auVar135);
        auVar111._8_8_ = auVar58._0_8_;
        auVar111._0_8_ = auVar58._0_8_;
        auVar58 = vshufpd_avx(auVar58,auVar58,3);
        auVar60 = vshufps_avx(auVar46,auVar46,0x55);
        auVar58 = vsubps_avx(auVar58,auVar111);
        auVar60 = vfmadd213ps_fma(auVar58,auVar60,auVar111);
        fVar221 = auVar60._0_4_;
        auVar58 = vshufps_avx(auVar60,auVar60,0x55);
        auVar112._0_4_ = auVar57._0_4_ * fVar221 + auVar72._0_4_ * auVar58._0_4_;
        auVar112._4_4_ = auVar57._4_4_ * fVar221 + auVar72._4_4_ * auVar58._4_4_;
        auVar112._8_4_ = auVar57._8_4_ * fVar221 + auVar72._8_4_ * auVar58._8_4_;
        auVar112._12_4_ = auVar57._12_4_ * fVar221 + auVar72._12_4_ * auVar58._12_4_;
        auVar46 = vsubps_avx(auVar46,auVar112);
        auVar58 = vandps_avx512vl(auVar60,auVar258._0_16_);
        auVar60 = vprolq_avx512vl(auVar58,0x20);
        auVar58 = vmaxss_avx(auVar60,auVar58);
        bVar41 = auVar58._0_4_ <= (float)local_2b0._0_4_;
      } while ((float)local_2b0._0_4_ <= auVar58._0_4_);
      auVar58 = vucomiss_avx512f(auVar51);
      if (bVar41) {
        auVar57 = vucomiss_avx512f(auVar58);
        auVar259 = ZEXT1664(auVar57);
        if (bVar41) {
          vmovshdup_avx(auVar58);
          auVar57 = vucomiss_avx512f(auVar51);
          if (bVar41) {
            auVar60 = vucomiss_avx512f(auVar57);
            auVar259 = ZEXT1664(auVar60);
            if (bVar41) {
              auVar64 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar46 = vinsertps_avx(auVar64,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar64 = vdpps_avx(auVar46,local_2c0,0x7f);
              auVar63 = vdpps_avx(auVar46,local_2d0,0x7f);
              auVar65 = vdpps_avx(auVar46,local_2e0,0x7f);
              auVar66 = vdpps_avx(auVar46,local_2f0,0x7f);
              auVar43 = vdpps_avx(auVar46,local_300,0x7f);
              auVar44 = vdpps_avx(auVar46,local_310,0x7f);
              auVar45 = vdpps_avx(auVar46,local_320,0x7f);
              auVar46 = vdpps_avx(auVar46,local_330,0x7f);
              auVar47 = vsubss_avx512f(auVar60,auVar57);
              fVar217 = auVar57._0_4_;
              auVar57 = vfmadd231ss_fma(ZEXT416((uint)(fVar217 * auVar43._0_4_)),auVar47,auVar64);
              auVar64 = vfmadd231ss_fma(ZEXT416((uint)(auVar44._0_4_ * fVar217)),auVar47,auVar63);
              auVar63 = vfmadd231ss_fma(ZEXT416((uint)(auVar45._0_4_ * fVar217)),auVar47,auVar65);
              auVar65 = vfmadd231ss_fma(ZEXT416((uint)(fVar217 * auVar46._0_4_)),auVar47,auVar66);
              auVar60 = vsubss_avx512f(auVar60,auVar58);
              auVar173._0_4_ = auVar60._0_4_;
              fVar221 = auVar173._0_4_ * auVar173._0_4_ * auVar173._0_4_;
              auVar60 = vmulss_avx512f(auVar58,ZEXT416(0x40400000));
              fVar207 = auVar60._0_4_ * auVar173._0_4_ * auVar173._0_4_;
              local_120 = auVar58._0_4_;
              auVar164._0_4_ = local_120 * local_120;
              auVar164._4_4_ = auVar58._4_4_ * auVar58._4_4_;
              auVar164._8_4_ = auVar58._8_4_ * auVar58._8_4_;
              auVar164._12_4_ = auVar58._12_4_ * auVar58._12_4_;
              auVar60 = vmulss_avx512f(auVar164,ZEXT416(0x40400000));
              fVar216 = auVar173._0_4_ * auVar60._0_4_;
              fVar219 = local_120 * auVar164._0_4_;
              auVar60 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * auVar65._0_4_)),
                                        ZEXT416((uint)fVar216),auVar63);
              auVar60 = vfmadd231ss_fma(auVar60,ZEXT416((uint)fVar207),auVar64);
              auVar57 = vfmadd231ss_fma(auVar60,ZEXT416((uint)fVar221),auVar57);
              fVar218 = auVar57._0_4_;
              if ((fVar152 <= fVar218) &&
                 (fVar220 = *(float *)(ray + k * 4 + 0x100), fVar218 <= fVar220)) {
                auVar57 = vshufps_avx(auVar58,auVar58,0x55);
                auVar200._8_4_ = 0x3f800000;
                auVar200._0_8_ = 0x3f8000003f800000;
                auVar200._12_4_ = 0x3f800000;
                auVar60 = vsubps_avx(auVar200,auVar57);
                fVar175 = auVar57._0_4_;
                auVar205._0_4_ = fVar175 * (float)local_380._0_4_;
                fVar190 = auVar57._4_4_;
                auVar205._4_4_ = fVar190 * (float)local_380._4_4_;
                fVar191 = auVar57._8_4_;
                auVar205._8_4_ = fVar191 * fStack_378;
                fVar192 = auVar57._12_4_;
                auVar205._12_4_ = fVar192 * fStack_374;
                auVar215._0_4_ = fVar175 * (float)local_390._0_4_;
                auVar215._4_4_ = fVar190 * (float)local_390._4_4_;
                auVar215._8_4_ = fVar191 * fStack_388;
                auVar215._12_4_ = fVar192 * fStack_384;
                auVar232._0_4_ = fVar175 * (float)local_3a0._0_4_;
                auVar232._4_4_ = fVar190 * (float)local_3a0._4_4_;
                auVar232._8_4_ = fVar191 * fStack_398;
                auVar232._12_4_ = fVar192 * fStack_394;
                auVar187._0_4_ = fVar175 * (float)local_3b0._0_4_;
                auVar187._4_4_ = fVar190 * (float)local_3b0._4_4_;
                auVar187._8_4_ = fVar191 * fStack_3a8;
                auVar187._12_4_ = fVar192 * fStack_3a4;
                auVar57 = vfmadd231ps_fma(auVar205,auVar60,local_340);
                auVar64 = vfmadd231ps_fma(auVar215,auVar60,local_350);
                auVar63 = vfmadd231ps_fma(auVar232,auVar60,local_360);
                auVar65 = vfmadd231ps_fma(auVar187,auVar60,local_370);
                auVar57 = vsubps_avx(auVar64,auVar57);
                auVar60 = vsubps_avx(auVar63,auVar64);
                auVar64 = vsubps_avx(auVar65,auVar63);
                auVar233._0_4_ = local_120 * auVar60._0_4_;
                auVar233._4_4_ = local_120 * auVar60._4_4_;
                auVar233._8_4_ = local_120 * auVar60._8_4_;
                auVar233._12_4_ = local_120 * auVar60._12_4_;
                auVar173._4_4_ = auVar173._0_4_;
                auVar173._8_4_ = auVar173._0_4_;
                auVar173._12_4_ = auVar173._0_4_;
                auVar57 = vfmadd231ps_fma(auVar233,auVar173,auVar57);
                auVar188._0_4_ = local_120 * auVar64._0_4_;
                auVar188._4_4_ = local_120 * auVar64._4_4_;
                auVar188._8_4_ = local_120 * auVar64._8_4_;
                auVar188._12_4_ = local_120 * auVar64._12_4_;
                auVar60 = vfmadd231ps_fma(auVar188,auVar173,auVar60);
                auVar189._0_4_ = local_120 * auVar60._0_4_;
                auVar189._4_4_ = local_120 * auVar60._4_4_;
                auVar189._8_4_ = local_120 * auVar60._8_4_;
                auVar189._12_4_ = local_120 * auVar60._12_4_;
                auVar57 = vfmadd231ps_fma(auVar189,auVar173,auVar57);
                auVar52 = vmulps_avx512vl(auVar57,auVar52);
                pGVar9 = (context->scene->geometries).items[uVar6].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar165._0_4_ = fVar219 * (float)local_3f0._0_4_;
                  auVar165._4_4_ = fVar219 * (float)local_3f0._4_4_;
                  auVar165._8_4_ = fVar219 * fStack_3e8;
                  auVar165._12_4_ = fVar219 * fStack_3e4;
                  auVar149._4_4_ = fVar216;
                  auVar149._0_4_ = fVar216;
                  auVar149._8_4_ = fVar216;
                  auVar149._12_4_ = fVar216;
                  auVar57 = vfmadd132ps_fma(auVar149,auVar165,local_3e0);
                  auVar136._4_4_ = fVar207;
                  auVar136._0_4_ = fVar207;
                  auVar136._8_4_ = fVar207;
                  auVar136._12_4_ = fVar207;
                  auVar57 = vfmadd132ps_fma(auVar136,auVar57,local_3d0);
                  auVar128._4_4_ = fVar221;
                  auVar128._0_4_ = fVar221;
                  auVar128._8_4_ = fVar221;
                  auVar128._12_4_ = fVar221;
                  auVar64 = vfmadd132ps_fma(auVar128,auVar57,local_3c0);
                  auVar57 = vshufps_avx(auVar64,auVar64,0xc9);
                  auVar60 = vshufps_avx(auVar52,auVar52,0xc9);
                  auVar129._0_4_ = auVar64._0_4_ * auVar60._0_4_;
                  auVar129._4_4_ = auVar64._4_4_ * auVar60._4_4_;
                  auVar129._8_4_ = auVar64._8_4_ * auVar60._8_4_;
                  auVar129._12_4_ = auVar64._12_4_ * auVar60._12_4_;
                  auVar52 = vfmsub231ps_fma(auVar129,auVar52,auVar57);
                  local_140 = auVar52._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar218;
                    uVar106 = vextractps_avx(auVar52,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar106;
                    uVar106 = vextractps_avx(auVar52,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar106;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                    *(float *)(ray + k * 4 + 0x1e0) = local_120;
                    *(float *)(ray + k * 4 + 0x200) = fVar217;
                    *(uint *)(ray + k * 4 + 0x220) = uVar7;
                    *(uint *)(ray + k * 4 + 0x240) = uVar6;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    goto LAB_018c17a6;
                  }
                  auVar137._8_4_ = 1;
                  auVar137._0_8_ = 0x100000001;
                  auVar137._12_4_ = 1;
                  auVar137._16_4_ = 1;
                  auVar137._20_4_ = 1;
                  auVar137._24_4_ = 1;
                  auVar137._28_4_ = 1;
                  local_100 = vpermps_avx2(auVar137,ZEXT1632(auVar58));
                  auVar91 = vpermps_avx2(auVar137,ZEXT1632(auVar52));
                  auVar150._8_4_ = 2;
                  auVar150._0_8_ = 0x200000002;
                  auVar150._12_4_ = 2;
                  auVar150._16_4_ = 2;
                  auVar150._20_4_ = 2;
                  auVar150._24_4_ = 2;
                  auVar150._28_4_ = 2;
                  local_160 = vpermps_avx2(auVar150,ZEXT1632(auVar52));
                  local_180[0] = (RTCHitN)auVar91[0];
                  local_180[1] = (RTCHitN)auVar91[1];
                  local_180[2] = (RTCHitN)auVar91[2];
                  local_180[3] = (RTCHitN)auVar91[3];
                  local_180[4] = (RTCHitN)auVar91[4];
                  local_180[5] = (RTCHitN)auVar91[5];
                  local_180[6] = (RTCHitN)auVar91[6];
                  local_180[7] = (RTCHitN)auVar91[7];
                  local_180[8] = (RTCHitN)auVar91[8];
                  local_180[9] = (RTCHitN)auVar91[9];
                  local_180[10] = (RTCHitN)auVar91[10];
                  local_180[0xb] = (RTCHitN)auVar91[0xb];
                  local_180[0xc] = (RTCHitN)auVar91[0xc];
                  local_180[0xd] = (RTCHitN)auVar91[0xd];
                  local_180[0xe] = (RTCHitN)auVar91[0xe];
                  local_180[0xf] = (RTCHitN)auVar91[0xf];
                  local_180[0x10] = (RTCHitN)auVar91[0x10];
                  local_180[0x11] = (RTCHitN)auVar91[0x11];
                  local_180[0x12] = (RTCHitN)auVar91[0x12];
                  local_180[0x13] = (RTCHitN)auVar91[0x13];
                  local_180[0x14] = (RTCHitN)auVar91[0x14];
                  local_180[0x15] = (RTCHitN)auVar91[0x15];
                  local_180[0x16] = (RTCHitN)auVar91[0x16];
                  local_180[0x17] = (RTCHitN)auVar91[0x17];
                  local_180[0x18] = (RTCHitN)auVar91[0x18];
                  local_180[0x19] = (RTCHitN)auVar91[0x19];
                  local_180[0x1a] = (RTCHitN)auVar91[0x1a];
                  local_180[0x1b] = (RTCHitN)auVar91[0x1b];
                  local_180[0x1c] = (RTCHitN)auVar91[0x1c];
                  local_180[0x1d] = (RTCHitN)auVar91[0x1d];
                  local_180[0x1e] = (RTCHitN)auVar91[0x1e];
                  local_180[0x1f] = (RTCHitN)auVar91[0x1f];
                  uStack_13c = local_140;
                  uStack_138 = local_140;
                  uStack_134 = local_140;
                  uStack_130 = local_140;
                  uStack_12c = local_140;
                  uStack_128 = local_140;
                  uStack_124 = local_140;
                  fStack_11c = local_120;
                  fStack_118 = local_120;
                  fStack_114 = local_120;
                  fStack_110 = local_120;
                  fStack_10c = local_120;
                  fStack_108 = local_120;
                  fStack_104 = local_120;
                  local_e0 = local_1e0._0_8_;
                  uStack_d8 = local_1e0._8_8_;
                  uStack_d0 = local_1e0._16_8_;
                  uStack_c8 = local_1e0._24_8_;
                  local_c0 = local_1c0;
                  vpcmpeqd_avx2(local_1c0,local_1c0);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar218;
                  local_420 = local_200;
                  local_460.valid = (int *)local_420;
                  local_460.geometryUserPtr = pGVar9->userPtr;
                  local_460.context = context->user;
                  local_460.hit = local_180;
                  local_460.N = 8;
                  local_460.ray = (RTCRayN *)ray;
                  if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar9->intersectionFilterN)(&local_460);
                    auVar256 = ZEXT3264(_DAT_01fb9fe0);
                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar255 = ZEXT1664(auVar58);
                    auVar91 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar254 = ZEXT3264(auVar91);
                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar260 = ZEXT1664(auVar58);
                    auVar259 = ZEXT464(0x3f800000);
                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar257 = ZEXT1664(auVar58);
                    auVar58 = vxorps_avx512vl(auVar51,auVar51);
                    auVar253 = ZEXT1664(auVar58);
                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar258 = ZEXT1664(auVar58);
                  }
                  auVar58 = auVar253._0_16_;
                  if (local_420 != (undefined1  [32])0x0) {
                    p_Var14 = context->args->filter;
                    if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var14)(&local_460);
                      auVar256 = ZEXT3264(_DAT_01fb9fe0);
                      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar255 = ZEXT1664(auVar51);
                      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar254 = ZEXT3264(auVar91);
                      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar260 = ZEXT1664(auVar51);
                      auVar259 = ZEXT464(0x3f800000);
                      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar257 = ZEXT1664(auVar51);
                      auVar58 = vxorps_avx512vl(auVar58,auVar58);
                      auVar253 = ZEXT1664(auVar58);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar258 = ZEXT1664(auVar58);
                    }
                    if (local_420 != (undefined1  [32])0x0) {
                      uVar3 = vptestmd_avx512vl(local_420,local_420);
                      iVar105 = *(int *)(local_460.hit + 4);
                      iVar24 = *(int *)(local_460.hit + 8);
                      iVar25 = *(int *)(local_460.hit + 0xc);
                      iVar26 = *(int *)(local_460.hit + 0x10);
                      iVar27 = *(int *)(local_460.hit + 0x14);
                      iVar28 = *(int *)(local_460.hit + 0x18);
                      iVar29 = *(int *)(local_460.hit + 0x1c);
                      bVar30 = (byte)uVar3;
                      bVar41 = (bool)((byte)(uVar3 >> 1) & 1);
                      bVar42 = (bool)((byte)(uVar3 >> 2) & 1);
                      bVar39 = (bool)((byte)(uVar3 >> 3) & 1);
                      bVar40 = (bool)((byte)(uVar3 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                      bVar17 = SUB81(uVar3 >> 7,0);
                      *(uint *)(local_460.ray + 0x180) =
                           (uint)(bVar30 & 1) * *(int *)local_460.hit |
                           (uint)!(bool)(bVar30 & 1) * *(int *)(local_460.ray + 0x180);
                      *(uint *)(local_460.ray + 0x184) =
                           (uint)bVar41 * iVar105 | (uint)!bVar41 * *(int *)(local_460.ray + 0x184);
                      *(uint *)(local_460.ray + 0x188) =
                           (uint)bVar42 * iVar24 | (uint)!bVar42 * *(int *)(local_460.ray + 0x188);
                      *(uint *)(local_460.ray + 0x18c) =
                           (uint)bVar39 * iVar25 | (uint)!bVar39 * *(int *)(local_460.ray + 0x18c);
                      *(uint *)(local_460.ray + 400) =
                           (uint)bVar40 * iVar26 | (uint)!bVar40 * *(int *)(local_460.ray + 400);
                      *(uint *)(local_460.ray + 0x194) =
                           (uint)bVar15 * iVar27 | (uint)!bVar15 * *(int *)(local_460.ray + 0x194);
                      *(uint *)(local_460.ray + 0x198) =
                           (uint)bVar16 * iVar28 | (uint)!bVar16 * *(int *)(local_460.ray + 0x198);
                      *(uint *)(local_460.ray + 0x19c) =
                           (uint)bVar17 * iVar29 | (uint)!bVar17 * *(int *)(local_460.ray + 0x19c);
                      iVar105 = *(int *)(local_460.hit + 0x24);
                      iVar24 = *(int *)(local_460.hit + 0x28);
                      iVar25 = *(int *)(local_460.hit + 0x2c);
                      iVar26 = *(int *)(local_460.hit + 0x30);
                      iVar27 = *(int *)(local_460.hit + 0x34);
                      iVar28 = *(int *)(local_460.hit + 0x38);
                      iVar29 = *(int *)(local_460.hit + 0x3c);
                      bVar41 = (bool)((byte)(uVar3 >> 1) & 1);
                      bVar42 = (bool)((byte)(uVar3 >> 2) & 1);
                      bVar39 = (bool)((byte)(uVar3 >> 3) & 1);
                      bVar40 = (bool)((byte)(uVar3 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                      bVar17 = SUB81(uVar3 >> 7,0);
                      *(uint *)(local_460.ray + 0x1a0) =
                           (uint)(bVar30 & 1) * *(int *)(local_460.hit + 0x20) |
                           (uint)!(bool)(bVar30 & 1) * *(int *)(local_460.ray + 0x1a0);
                      *(uint *)(local_460.ray + 0x1a4) =
                           (uint)bVar41 * iVar105 | (uint)!bVar41 * *(int *)(local_460.ray + 0x1a4);
                      *(uint *)(local_460.ray + 0x1a8) =
                           (uint)bVar42 * iVar24 | (uint)!bVar42 * *(int *)(local_460.ray + 0x1a8);
                      *(uint *)(local_460.ray + 0x1ac) =
                           (uint)bVar39 * iVar25 | (uint)!bVar39 * *(int *)(local_460.ray + 0x1ac);
                      *(uint *)(local_460.ray + 0x1b0) =
                           (uint)bVar40 * iVar26 | (uint)!bVar40 * *(int *)(local_460.ray + 0x1b0);
                      *(uint *)(local_460.ray + 0x1b4) =
                           (uint)bVar15 * iVar27 | (uint)!bVar15 * *(int *)(local_460.ray + 0x1b4);
                      *(uint *)(local_460.ray + 0x1b8) =
                           (uint)bVar16 * iVar28 | (uint)!bVar16 * *(int *)(local_460.ray + 0x1b8);
                      *(uint *)(local_460.ray + 0x1bc) =
                           (uint)bVar17 * iVar29 | (uint)!bVar17 * *(int *)(local_460.ray + 0x1bc);
                      iVar105 = *(int *)(local_460.hit + 0x44);
                      iVar24 = *(int *)(local_460.hit + 0x48);
                      iVar25 = *(int *)(local_460.hit + 0x4c);
                      iVar26 = *(int *)(local_460.hit + 0x50);
                      iVar27 = *(int *)(local_460.hit + 0x54);
                      iVar28 = *(int *)(local_460.hit + 0x58);
                      iVar29 = *(int *)(local_460.hit + 0x5c);
                      bVar41 = (bool)((byte)(uVar3 >> 1) & 1);
                      bVar42 = (bool)((byte)(uVar3 >> 2) & 1);
                      bVar39 = (bool)((byte)(uVar3 >> 3) & 1);
                      bVar40 = (bool)((byte)(uVar3 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                      bVar17 = SUB81(uVar3 >> 7,0);
                      *(uint *)(local_460.ray + 0x1c0) =
                           (uint)(bVar30 & 1) * *(int *)(local_460.hit + 0x40) |
                           (uint)!(bool)(bVar30 & 1) * *(int *)(local_460.ray + 0x1c0);
                      *(uint *)(local_460.ray + 0x1c4) =
                           (uint)bVar41 * iVar105 | (uint)!bVar41 * *(int *)(local_460.ray + 0x1c4);
                      *(uint *)(local_460.ray + 0x1c8) =
                           (uint)bVar42 * iVar24 | (uint)!bVar42 * *(int *)(local_460.ray + 0x1c8);
                      *(uint *)(local_460.ray + 0x1cc) =
                           (uint)bVar39 * iVar25 | (uint)!bVar39 * *(int *)(local_460.ray + 0x1cc);
                      *(uint *)(local_460.ray + 0x1d0) =
                           (uint)bVar40 * iVar26 | (uint)!bVar40 * *(int *)(local_460.ray + 0x1d0);
                      *(uint *)(local_460.ray + 0x1d4) =
                           (uint)bVar15 * iVar27 | (uint)!bVar15 * *(int *)(local_460.ray + 0x1d4);
                      *(uint *)(local_460.ray + 0x1d8) =
                           (uint)bVar16 * iVar28 | (uint)!bVar16 * *(int *)(local_460.ray + 0x1d8);
                      *(uint *)(local_460.ray + 0x1dc) =
                           (uint)bVar17 * iVar29 | (uint)!bVar17 * *(int *)(local_460.ray + 0x1dc);
                      iVar105 = *(int *)(local_460.hit + 100);
                      iVar24 = *(int *)(local_460.hit + 0x68);
                      iVar25 = *(int *)(local_460.hit + 0x6c);
                      iVar26 = *(int *)(local_460.hit + 0x70);
                      iVar27 = *(int *)(local_460.hit + 0x74);
                      iVar28 = *(int *)(local_460.hit + 0x78);
                      iVar29 = *(int *)(local_460.hit + 0x7c);
                      bVar41 = (bool)((byte)(uVar3 >> 1) & 1);
                      bVar42 = (bool)((byte)(uVar3 >> 2) & 1);
                      bVar39 = (bool)((byte)(uVar3 >> 3) & 1);
                      bVar40 = (bool)((byte)(uVar3 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                      bVar17 = SUB81(uVar3 >> 7,0);
                      *(uint *)(local_460.ray + 0x1e0) =
                           (uint)(bVar30 & 1) * *(int *)(local_460.hit + 0x60) |
                           (uint)!(bool)(bVar30 & 1) * *(int *)(local_460.ray + 0x1e0);
                      *(uint *)(local_460.ray + 0x1e4) =
                           (uint)bVar41 * iVar105 | (uint)!bVar41 * *(int *)(local_460.ray + 0x1e4);
                      *(uint *)(local_460.ray + 0x1e8) =
                           (uint)bVar42 * iVar24 | (uint)!bVar42 * *(int *)(local_460.ray + 0x1e8);
                      *(uint *)(local_460.ray + 0x1ec) =
                           (uint)bVar39 * iVar25 | (uint)!bVar39 * *(int *)(local_460.ray + 0x1ec);
                      *(uint *)(local_460.ray + 0x1f0) =
                           (uint)bVar40 * iVar26 | (uint)!bVar40 * *(int *)(local_460.ray + 0x1f0);
                      *(uint *)(local_460.ray + 500) =
                           (uint)bVar15 * iVar27 | (uint)!bVar15 * *(int *)(local_460.ray + 500);
                      *(uint *)(local_460.ray + 0x1f8) =
                           (uint)bVar16 * iVar28 | (uint)!bVar16 * *(int *)(local_460.ray + 0x1f8);
                      *(uint *)(local_460.ray + 0x1fc) =
                           (uint)bVar17 * iVar29 | (uint)!bVar17 * *(int *)(local_460.ray + 0x1fc);
                      iVar105 = *(int *)(local_460.hit + 0x84);
                      iVar24 = *(int *)(local_460.hit + 0x88);
                      iVar25 = *(int *)(local_460.hit + 0x8c);
                      iVar26 = *(int *)(local_460.hit + 0x90);
                      iVar27 = *(int *)(local_460.hit + 0x94);
                      iVar28 = *(int *)(local_460.hit + 0x98);
                      iVar29 = *(int *)(local_460.hit + 0x9c);
                      bVar41 = (bool)((byte)(uVar3 >> 1) & 1);
                      bVar42 = (bool)((byte)(uVar3 >> 2) & 1);
                      bVar39 = (bool)((byte)(uVar3 >> 3) & 1);
                      bVar40 = (bool)((byte)(uVar3 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                      bVar17 = SUB81(uVar3 >> 7,0);
                      *(uint *)(local_460.ray + 0x200) =
                           (uint)(bVar30 & 1) * *(int *)(local_460.hit + 0x80) |
                           (uint)!(bool)(bVar30 & 1) * *(int *)(local_460.ray + 0x200);
                      *(uint *)(local_460.ray + 0x204) =
                           (uint)bVar41 * iVar105 | (uint)!bVar41 * *(int *)(local_460.ray + 0x204);
                      *(uint *)(local_460.ray + 0x208) =
                           (uint)bVar42 * iVar24 | (uint)!bVar42 * *(int *)(local_460.ray + 0x208);
                      *(uint *)(local_460.ray + 0x20c) =
                           (uint)bVar39 * iVar25 | (uint)!bVar39 * *(int *)(local_460.ray + 0x20c);
                      *(uint *)(local_460.ray + 0x210) =
                           (uint)bVar40 * iVar26 | (uint)!bVar40 * *(int *)(local_460.ray + 0x210);
                      *(uint *)(local_460.ray + 0x214) =
                           (uint)bVar15 * iVar27 | (uint)!bVar15 * *(int *)(local_460.ray + 0x214);
                      *(uint *)(local_460.ray + 0x218) =
                           (uint)bVar16 * iVar28 | (uint)!bVar16 * *(int *)(local_460.ray + 0x218);
                      *(uint *)(local_460.ray + 0x21c) =
                           (uint)bVar17 * iVar29 | (uint)!bVar17 * *(int *)(local_460.ray + 0x21c);
                      auVar91 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0xa0));
                      *(undefined1 (*) [32])(local_460.ray + 0x220) = auVar91;
                      auVar91 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0xc0));
                      *(undefined1 (*) [32])(local_460.ray + 0x240) = auVar91;
                      auVar91 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0xe0));
                      *(undefined1 (*) [32])(local_460.ray + 0x260) = auVar91;
                      auVar91 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0x100));
                      *(undefined1 (*) [32])(local_460.ray + 0x280) = auVar91;
                      goto LAB_018c17a6;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar220;
                }
              }
            }
          }
        }
      }
      goto LAB_018c17a6;
    }
    auVar44 = vinsertps_avx(auVar62,auVar69,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }